

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::avx512::InstanceArrayIntersectorKMB<4>::intersect
               (vbool<4>_conflict *valid_i,Precalculations *pre,RayHitK<4> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  byte bVar54;
  undefined4 in_EAX;
  ulong uVar56;
  uint uVar57;
  long lVar58;
  _func_int *p_Var59;
  byte bVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  uint uVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  uint uVar158;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar174;
  float fVar175;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar176;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined4 uVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar214 [12];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 in_ZMM6 [64];
  float fVar257;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar267;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar265;
  float fVar266;
  undefined1 in_ZMM7 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 in_ZMM9 [64];
  float fVar282;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar301;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar299;
  float fVar300;
  undefined1 in_ZMM10 [64];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar329 [16];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar330 [16];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar342 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar343 [16];
  undefined1 in_ZMM31 [64];
  RayQueryContext newcontext;
  vint<4> mask;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  RTCIntersectArguments *local_98;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  uint uVar55;
  undefined1 auVar122 [16];
  
  auVar68 = in_ZMM10._0_16_;
  auVar89 = in_ZMM19._0_16_;
  auVar70 = in_ZMM21._0_16_;
  auVar69 = in_ZMM20._0_16_;
  auVar97 = in_ZMM18._0_16_;
  auVar88 = in_ZMM6._0_16_;
  auVar87 = in_ZMM16._0_16_;
  auVar86 = in_ZMM15._0_16_;
  auVar85 = in_ZMM14._0_16_;
  auVar84 = in_ZMM12._0_16_;
  uVar63 = prim->primID_;
  pGVar4 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var59 = *(_func_int **)&pGVar4->field_0x58;
  if ((p_Var59 != (_func_int *)0x0) ||
     ((uVar56 = (ulong)*(uint *)(*(long *)&pGVar4[1].time_range.upper +
                                (long)pGVar4[1].intersectionFilterN * (ulong)uVar63),
      uVar56 != 0xffffffff &&
      (p_Var59 = pGVar4[1].super_RefCount._vptr_RefCount[uVar56], p_Var59 != (_func_int *)0x0)))) {
    uVar55 = pGVar4->mask;
    auVar90._4_4_ = uVar55;
    auVar90._0_4_ = uVar55;
    auVar90._8_4_ = uVar55;
    auVar90._12_4_ = uVar55;
    uVar14 = vptestmd_avx512vl(auVar90,*(undefined1 (*) [16])(ray + 0x90));
    bVar54 = valid_i->v & (byte)uVar14 & 0xf;
    uVar55 = CONCAT31((int3)((uint)in_EAX >> 8),bVar54);
    if ((bVar54 != 0) && (pRVar5 = context->user, pRVar5->instID[0] == 0xffffffff)) {
      pRVar5->instID[0] = prim->instID_;
      pRVar5->instPrimID[0] = uVar63;
      uVar56 = (ulong)prim->primID_;
      if ((pGVar4->field_8).field_0x1 == '\x01') {
        fVar163 = (pGVar4->time_range).lower;
        auVar84._4_4_ = fVar163;
        auVar84._0_4_ = fVar163;
        auVar84._8_4_ = fVar163;
        auVar84._12_4_ = fVar163;
        fVar174 = pGVar4->fnumTimeSegments;
        auVar84 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar84);
        fVar163 = (pGVar4->time_range).upper - fVar163;
        auVar85._4_4_ = fVar163;
        auVar85._0_4_ = fVar163;
        auVar85._8_4_ = fVar163;
        auVar85._12_4_ = fVar163;
        auVar84 = vdivps_avx(auVar84,auVar85);
        auVar86._0_4_ = fVar174 * auVar84._0_4_;
        auVar86._4_4_ = fVar174 * auVar84._4_4_;
        auVar86._8_4_ = fVar174 * auVar84._8_4_;
        auVar86._12_4_ = fVar174 * auVar84._12_4_;
        auVar84 = vroundps_avx(auVar86,1);
        fVar174 = fVar174 + -1.0;
        auVar87._4_4_ = fVar174;
        auVar87._0_4_ = fVar174;
        auVar87._8_4_ = fVar174;
        auVar87._12_4_ = fVar174;
        auVar84 = vminps_avx(auVar84,auVar87);
        auVar87 = ZEXT816(0) << 0x20;
        auVar84 = vmaxps_avx(auVar84,auVar87);
        auVar85 = vsubps_avx(auVar86,auVar84);
        local_a8 = vcvtps2dq_avx(auVar84);
        uVar63 = 0;
        for (uVar152 = (uint)bVar54; (uVar152 & 1) == 0; uVar152 = uVar152 >> 1 | 0x80000000) {
          uVar63 = uVar63 + 1;
        }
        auVar84 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpeqd_avx512vl(local_a8,auVar84);
        fVar174 = auVar85._4_4_;
        fVar175 = auVar85._8_4_;
        fVar176 = auVar85._12_4_;
        fVar163 = auVar85._0_4_;
        if ((byte)(bVar54 ^ 0xf | (byte)uVar14 & 0xf) == 0xf) {
          plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                           (long)*(int *)(local_a8 + (ulong)uVar63 * 4) * 0x38);
          iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                          (long)*(int *)(local_a8 + (ulong)uVar63 * 4) * 0x38);
          if (iVar3 == 0x9134) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
            local_a8 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
            auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
            auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
            auVar88 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
            auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
            auVar68 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
          }
          else if (iVar3 == 0x9234) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar197._8_8_ = 0;
            auVar197._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
            auVar237._8_8_ = 0;
            auVar237._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            local_a8 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,auVar197)
            ;
            auVar84 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                         auVar237);
            auVar198._8_8_ = 0;
            auVar198._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            auVar88 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                         auVar198);
            auVar199._8_8_ = 0;
            auVar199._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
            auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                         auVar199);
          }
          else if (iVar3 == 0xb001) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar180._8_8_ = 0;
            auVar180._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar84 = vinsertps_avx(auVar180,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
            auVar181._8_8_ = 0;
            auVar181._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
            auVar87 = vpermt2ps_avx512vl(auVar181,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58)));
            auVar250._8_8_ = 0;
            auVar250._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            fVar64 = *(float *)(lVar6 + 0x24 + lVar58);
            fVar65 = *(float *)(lVar6 + 0x28 + lVar58);
            fVar66 = *(float *)(lVar6 + 0x2c + lVar58);
            auVar88 = vpermt2ps_avx512vl(auVar250,_DAT_01fefe90,
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
            fVar67 = *(float *)(lVar6 + 0x30 + lVar58);
            auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * fVar65)),ZEXT416((uint)fVar64),
                                      ZEXT416((uint)fVar64));
            auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
            auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
            auVar68 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar86._0_4_));
            fVar257 = auVar68._0_4_;
            fVar257 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar86._0_4_ * -0.5;
            auVar68 = vinsertps_avx(auVar88,ZEXT416((uint)(fVar64 * fVar257)),0x30);
            local_a8 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar65 * fVar257)),0x30);
            auVar88 = vinsertps_avx(auVar84,ZEXT416((uint)(fVar67 * fVar257)),0x30);
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
            auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
            auVar84 = vinsertps_avx(auVar84,ZEXT416((uint)(fVar66 * fVar257)),0x30);
          }
          else if (iVar3 == 0x9244) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            local_a8 = *(undefined1 (*) [16])(lVar6 + lVar58);
            auVar84 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar58);
            auVar88 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar58);
            auVar68 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar58);
          }
          local_158._4_4_ = local_a8._0_4_;
          auVar86 = vshufps_avx(local_a8,local_a8,0x55);
          auVar87 = vshufps_avx(local_a8,local_a8,0xaa);
          auVar90 = vshufps_avx(local_a8,local_a8,0xff);
          local_138._4_4_ = auVar84._0_4_;
          auVar91 = vshufps_avx(auVar84,auVar84,0x55);
          auVar92 = vshufps_avx(auVar84,auVar84,0xaa);
          auVar84 = vshufps_avx(auVar84,auVar84,0xff);
          local_148._4_4_ = auVar88._0_4_;
          auVar93 = vshufps_avx(auVar88,auVar88,0x55);
          auVar94 = vshufps_avx(auVar88,auVar88,0xaa);
          auVar96 = vshufps_avx512vl(auVar88,auVar88,0xff);
          local_168._4_4_ = auVar68._0_4_;
          auVar88 = vshufps_avx(auVar68,auVar68,0x55);
          auVar95 = vshufps_avx(auVar68,auVar68,0xaa);
          auVar68 = vshufps_avx512vl(auVar68,auVar68,0xff);
          iVar3 = (int)plVar1[0xb];
          local_168._0_4_ = local_168._4_4_;
          local_168._8_4_ = local_168._4_4_;
          local_168._12_4_ = local_168._4_4_;
          local_158._0_4_ = local_158._4_4_;
          local_158._8_4_ = local_158._4_4_;
          local_158._12_4_ = local_158._4_4_;
          local_138._0_4_ = local_138._4_4_;
          local_138._8_4_ = local_138._4_4_;
          local_138._12_4_ = local_138._4_4_;
          local_148._0_4_ = local_148._4_4_;
          local_148._8_4_ = local_148._4_4_;
          local_148._12_4_ = local_148._4_4_;
          if (iVar3 == 0x9134) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar97 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
            auVar97 = vinsertps_avx512f(auVar97,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
            auVar69 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
            auVar69 = vinsertps_avx512f(auVar69,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
            auVar70 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                        ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
            auVar70 = vinsertps_avx512f(auVar70,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
            auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                        ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
            auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
          }
          else if (iVar3 == 0x9234) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar285._8_8_ = 0;
            auVar285._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
            auVar97 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,auVar285);
            auVar329._8_8_ = 0;
            auVar329._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar69 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                         auVar329);
            auVar286._8_8_ = 0;
            auVar286._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            auVar70 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                         auVar286);
            auVar287._8_8_ = 0;
            auVar287._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
            auVar89 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                         auVar287);
          }
          else if (iVar3 == 0xb001) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar288._8_8_ = 0;
            auVar288._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar69 = vinsertps_avx(auVar288,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
            auVar318._8_8_ = 0;
            auVar318._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
            auVar97 = vpermt2ps_avx512vl(auVar318,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58)));
            uVar63 = *(uint *)(lVar6 + 0x18 + lVar58);
            uVar152 = *(uint *)(lVar6 + 0x24 + lVar58);
            uVar57 = *(uint *)(lVar6 + 0x28 + lVar58);
            uVar158 = *(uint *)(lVar6 + 0x2c + lVar58);
            auVar330._8_8_ = 0;
            auVar330._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            auVar70 = vpermt2ps_avx512vl(auVar330,_DAT_01fefe90,ZEXT416(uVar63));
            uVar2 = *(uint *)(lVar6 + 0x30 + lVar58);
            auVar89 = vmulss_avx512f(ZEXT416(uVar57),ZEXT416(uVar57));
            auVar89 = vfmadd231ss_avx512f(auVar89,ZEXT416(uVar152),ZEXT416(uVar152));
            auVar89 = vfmadd231ss_avx512f(auVar89,ZEXT416(uVar158),ZEXT416(uVar158));
            auVar89 = vfmadd231ss_avx512f(auVar89,ZEXT416(uVar2),ZEXT416(uVar2));
            auVar117 = vxorps_avx512vl(ZEXT416(uVar63),ZEXT416(uVar63));
            auVar112._4_12_ = auVar117._4_12_;
            auVar112._0_4_ = auVar89._0_4_;
            auVar117 = vrsqrt14ss_avx512f(auVar117,auVar112);
            auVar113 = vmulss_avx512f(auVar117,ZEXT416(0x3fc00000));
            auVar89 = vmulss_avx512f(auVar89,ZEXT416(0xbf000000));
            auVar89 = vmulss_avx512f(auVar117,auVar89);
            auVar117 = vmulss_avx512f(auVar117,auVar117);
            auVar89 = vmulss_avx512f(auVar117,auVar89);
            auVar117 = vaddss_avx512f(auVar113,auVar89);
            auVar89 = vmulss_avx512f(ZEXT416(uVar152),auVar117);
            auVar89 = vinsertps_avx512f(auVar70,auVar89,0x30);
            auVar70 = vmulss_avx512f(ZEXT416(uVar57),auVar117);
            auVar97 = vinsertps_avx512f(auVar97,auVar70,0x30);
            auVar113 = vmulss_avx512f(ZEXT416(uVar158),auVar117);
            auVar70 = vmulss_avx512f(ZEXT416(uVar2),auVar117);
            auVar70 = vinsertps_avx512f(auVar69,auVar70,0x30);
            auVar69 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                        ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
            auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
            auVar69 = vinsertps_avx512f(auVar69,auVar113,0x30);
          }
          else if (iVar3 == 0x9244) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar97 = *(undefined1 (*) [16])(lVar6 + lVar58);
            auVar69 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar58);
            auVar70 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar58);
            auVar89 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar58);
          }
          auVar113 = vshufps_avx512vl(auVar97,auVar97,0xff);
          auVar114 = vshufps_avx512vl(auVar69,auVar69,0xff);
          auVar115 = vshufps_avx512vl(auVar70,auVar70,0xff);
          auVar116 = vshufps_avx512vl(auVar89,auVar89,0xff);
          auVar117 = vmulps_avx512vl(auVar68,auVar116);
          auVar118 = vmulps_avx512vl(auVar90,auVar113);
          auVar119 = vmulps_avx512vl(auVar84,auVar114);
          auVar120 = vmulps_avx512vl(auVar96,auVar115);
          auVar289._0_4_ = auVar120._0_4_ + auVar119._0_4_ + auVar118._0_4_ + auVar117._0_4_;
          auVar289._4_4_ = auVar120._4_4_ + auVar119._4_4_ + auVar118._4_4_ + auVar117._4_4_;
          auVar289._8_4_ = auVar120._8_4_ + auVar119._8_4_ + auVar118._8_4_ + auVar117._8_4_;
          auVar289._12_4_ = auVar120._12_4_ + auVar119._12_4_ + auVar118._12_4_ + auVar117._12_4_;
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar117 = vxorps_avx512vl(auVar289,auVar118);
          uVar56 = vcmpps_avx512vl(auVar289,auVar117,1);
          auVar139 = ZEXT816(0) << 0x20;
          auVar119 = vmaxps_avx512vl(auVar117,auVar289);
          auVar15._8_4_ = 0x7fffffff;
          auVar15._0_8_ = 0x7fffffff7fffffff;
          auVar15._12_4_ = 0x7fffffff;
          auVar117 = vandps_avx512vl(auVar289,auVar15);
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          uVar61 = vcmpps_avx512vl(auVar119,auVar139,1);
          uVar62 = vcmpps_avx512vl(auVar117,auVar120,6);
          auVar16._8_4_ = 0xbb8d3753;
          auVar16._0_8_ = 0xbb8d3753bb8d3753;
          auVar16._12_4_ = 0xbb8d3753;
          auVar121 = vmulps_avx512vl(auVar117,auVar16);
          auVar17._8_4_ = 0x3c9df1b8;
          auVar17._0_8_ = 0x3c9df1b83c9df1b8;
          auVar17._12_4_ = 0x3c9df1b8;
          auVar121 = vaddps_avx512vl(auVar121,auVar17);
          auVar121 = vmulps_avx512vl(auVar117,auVar121);
          auVar18._8_4_ = 0xbd37e81c;
          auVar18._0_8_ = 0xbd37e81cbd37e81c;
          auVar18._12_4_ = 0xbd37e81c;
          auVar121 = vaddps_avx512vl(auVar121,auVar18);
          auVar121 = vmulps_avx512vl(auVar117,auVar121);
          auVar19._8_4_ = 0x3db3edac;
          auVar19._0_8_ = 0x3db3edac3db3edac;
          auVar19._12_4_ = 0x3db3edac;
          auVar121 = vaddps_avx512vl(auVar121,auVar19);
          auVar121 = vmulps_avx512vl(auVar117,auVar121);
          auVar20._8_4_ = 0xbe5ba881;
          auVar20._0_8_ = 0xbe5ba881be5ba881;
          auVar20._12_4_ = 0xbe5ba881;
          auVar121 = vaddps_avx512vl(auVar121,auVar20);
          auVar121 = vmulps_avx512vl(auVar117,auVar121);
          auVar21._8_4_ = 0x3fc90fd1;
          auVar21._0_8_ = 0x3fc90fd13fc90fd1;
          auVar21._12_4_ = 0x3fc90fd1;
          auVar121 = vaddps_avx512vl(auVar121,auVar21);
          auVar117 = vsubps_avx512vl(auVar120,auVar117);
          auVar117 = vsqrtps_avx(auVar117);
          auVar117 = vmulps_avx512vl(auVar117,auVar121);
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar117 = vsubps_avx512vl(auVar121,auVar117);
          auVar117 = vmaxps_avx(auVar139,auVar117);
          auVar122 = vxorps_avx512vl(auVar117,auVar118);
          bVar7 = (bool)((byte)uVar61 & 1);
          auVar123._0_4_ = (uint)bVar7 * auVar122._0_4_ | (uint)!bVar7 * auVar117._0_4_;
          bVar7 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar7 * auVar122._4_4_ | (uint)!bVar7 * auVar117._4_4_;
          bVar7 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar7 * auVar122._8_4_ | (uint)!bVar7 * auVar117._8_4_;
          bVar7 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar7 * auVar122._12_4_ | (uint)!bVar7 * auVar117._12_4_;
          auVar117 = vsubps_avx512vl(auVar121,auVar123);
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar7 = (bool)((byte)uVar62 & 1);
          bVar8 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar290._0_4_ =
               (float)((uint)bVar7 * auVar122._0_4_ | (uint)!bVar7 * auVar117._0_4_) * fVar163;
          auVar290._4_4_ =
               (float)((uint)bVar8 * auVar122._4_4_ | (uint)!bVar8 * auVar117._4_4_) * fVar174;
          auVar290._8_4_ =
               (float)((uint)bVar9 * auVar122._8_4_ | (uint)!bVar9 * auVar117._8_4_) * fVar175;
          auVar290._12_4_ =
               (float)((uint)bVar10 * auVar122._12_4_ | (uint)!bVar10 * auVar117._12_4_) * fVar176;
          auVar22._8_4_ = 0x3f22f983;
          auVar22._0_8_ = 0x3f22f9833f22f983;
          auVar22._12_4_ = 0x3f22f983;
          auVar117 = vmulps_avx512vl(auVar290,auVar22);
          auVar117 = vrndscaleps_avx512vl(auVar117,1);
          auVar121 = vmulps_avx512vl(auVar117,auVar121);
          auVar117 = vcvtps2dq_avx512vl(auVar117);
          auVar121 = vsubps_avx512vl(auVar290,auVar121);
          auVar122 = vmulps_avx512vl(auVar121,auVar121);
          auVar23._8_4_ = 0xb2d70013;
          auVar23._0_8_ = 0xb2d70013b2d70013;
          auVar23._12_4_ = 0xb2d70013;
          auVar124 = vmulps_avx512vl(auVar122,auVar23);
          auVar24._8_4_ = 0x363938a8;
          auVar24._0_8_ = 0x363938a8363938a8;
          auVar24._12_4_ = 0x363938a8;
          auVar124 = vaddps_avx512vl(auVar124,auVar24);
          auVar25._8_4_ = 3;
          auVar25._0_8_ = 0x300000003;
          auVar25._12_4_ = 3;
          auVar125 = vpandd_avx512vl(auVar117,auVar25);
          auVar311._8_4_ = 1;
          auVar311._0_8_ = 0x100000001;
          auVar311._12_4_ = 1;
          auVar26._8_4_ = 0xb48b634d;
          auVar26._0_8_ = 0xb48b634db48b634d;
          auVar26._12_4_ = 0xb48b634d;
          auVar126 = vmulps_avx512vl(auVar122,auVar26);
          uVar62 = vptestnmd_avx512vl(auVar117,auVar311);
          uVar62 = uVar62 & 0xf;
          auVar27._8_4_ = 0x37cfab9c;
          auVar27._0_8_ = 0x37cfab9c37cfab9c;
          auVar27._12_4_ = 0x37cfab9c;
          auVar117 = vaddps_avx512vl(auVar126,auVar27);
          auVar124 = vmulps_avx512vl(auVar122,auVar124);
          auVar28._8_4_ = 0xb9501096;
          auVar28._0_8_ = 0xb9501096b9501096;
          auVar28._12_4_ = 0xb9501096;
          auVar124 = vaddps_avx512vl(auVar124,auVar28);
          auVar117 = vmulps_avx512vl(auVar122,auVar117);
          auVar29._8_4_ = 0xbab60981;
          auVar29._0_8_ = 0xbab60981bab60981;
          auVar29._12_4_ = 0xbab60981;
          auVar117 = vaddps_avx512vl(auVar117,auVar29);
          auVar124 = vmulps_avx512vl(auVar122,auVar124);
          auVar30._8_4_ = 0x3c088898;
          auVar30._0_8_ = 0x3c0888983c088898;
          auVar30._12_4_ = 0x3c088898;
          auVar124 = vaddps_avx512vl(auVar124,auVar30);
          auVar117 = vmulps_avx512vl(auVar122,auVar117);
          auVar31._8_4_ = 0x3d2aaaa4;
          auVar31._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar31._12_4_ = 0x3d2aaaa4;
          auVar117 = vaddps_avx512vl(auVar117,auVar31);
          auVar124 = vmulps_avx512vl(auVar122,auVar124);
          auVar32._8_4_ = 0xbe2aaaab;
          auVar32._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar32._12_4_ = 0xbe2aaaab;
          auVar124 = vaddps_avx512vl(auVar124,auVar32);
          uVar61 = vpcmpgtd_avx512vl(auVar125,auVar311);
          uVar61 = uVar61 & 0xf;
          auVar117 = vmulps_avx512vl(auVar122,auVar117);
          auVar186._0_4_ = auVar117._0_4_ + -0.5;
          auVar186._4_4_ = auVar117._4_4_ + -0.5;
          auVar186._8_4_ = auVar117._8_4_ + -0.5;
          auVar186._12_4_ = auVar117._12_4_ + -0.5;
          auVar117 = vmulps_avx512vl(auVar122,auVar124);
          auVar122 = vmulps_avx512vl(auVar122,auVar186);
          auVar117 = vaddps_avx512vl(auVar117,auVar120);
          auVar117 = vmulps_avx512vl(auVar121,auVar117);
          auVar122 = vaddps_avx512vl(auVar122,auVar120);
          auVar124 = vblendmps_avx512vl(auVar122,auVar117);
          bVar7 = (bool)((byte)uVar62 & 1);
          auVar127._0_4_ = (uint)bVar7 * auVar124._0_4_ | (uint)!bVar7 * auVar121._0_4_;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar7 * auVar124._4_4_ | (uint)!bVar7 * auVar121._4_4_;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar7 * auVar124._8_4_ | (uint)!bVar7 * auVar121._8_4_;
          bVar7 = SUB81(uVar62 >> 3,0);
          auVar127._12_4_ = (uint)bVar7 * auVar124._12_4_ | (uint)!bVar7 * auVar121._12_4_;
          bVar7 = (bool)((byte)uVar62 & 1);
          auVar128._0_4_ = (uint)bVar7 * auVar122._0_4_ | (uint)!bVar7 * auVar117._0_4_;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar7 * auVar122._4_4_ | (uint)!bVar7 * auVar117._4_4_;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar7 * auVar122._8_4_ | (uint)!bVar7 * auVar117._8_4_;
          bVar7 = SUB81(uVar62 >> 3,0);
          auVar128._12_4_ = (uint)bVar7 * auVar122._12_4_ | (uint)!bVar7 * auVar117._12_4_;
          auVar117 = vpcmpeqd_avx(auVar122,auVar122);
          auVar117 = vpaddd_avx(auVar125,auVar117);
          auVar33._8_4_ = 2;
          auVar33._0_8_ = 0x200000002;
          auVar33._12_4_ = 2;
          uVar62 = vpcmpud_avx512vl(auVar117,auVar33,1);
          uVar62 = uVar62 & 0xf;
          auVar117 = vxorps_avx512vl(auVar116,auVar118);
          bVar54 = (byte)uVar56;
          auVar129._0_4_ =
               (uint)(bVar54 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar116._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar7 * auVar117._4_4_ | (uint)!bVar7 * auVar116._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar7 * auVar117._8_4_ | (uint)!bVar7 * auVar116._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar7 * auVar117._12_4_ | (uint)!bVar7 * auVar116._12_4_;
          auVar117 = vxorps_avx512vl(auVar113,auVar118);
          auVar130._0_4_ =
               (uint)(bVar54 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar113._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar7 * auVar117._4_4_ | (uint)!bVar7 * auVar113._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar7 * auVar117._8_4_ | (uint)!bVar7 * auVar113._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar7 * auVar117._12_4_ | (uint)!bVar7 * auVar113._12_4_;
          auVar113 = vfmsub213ps_avx512vl(auVar68,auVar119,auVar129);
          auVar116 = vfmsub213ps_avx512vl(auVar90,auVar119,auVar130);
          auVar117 = vmulps_avx512vl(auVar113,auVar113);
          auVar121 = vmulps_avx512vl(auVar116,auVar116);
          auVar117 = vaddps_avx512vl(auVar117,auVar121);
          auVar121 = vxorps_avx512vl(auVar114,auVar118);
          auVar131._0_4_ =
               (uint)(bVar54 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar114._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * auVar114._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * auVar114._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * auVar114._12_4_;
          auVar114 = vfmsub213ps_avx512vl(auVar84,auVar119,auVar131);
          auVar121 = vmulps_avx512vl(auVar114,auVar114);
          auVar117 = vaddps_avx512vl(auVar121,auVar117);
          auVar121 = vxorps_avx512vl(auVar115,auVar118);
          auVar132._0_4_ =
               (uint)(bVar54 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar115._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar7 * auVar121._4_4_ | (uint)!bVar7 * auVar115._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar7 * auVar121._8_4_ | (uint)!bVar7 * auVar115._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar7 * auVar121._12_4_ | (uint)!bVar7 * auVar115._12_4_;
          auVar115 = vfmsub213ps_avx512vl(auVar96,auVar119,auVar132);
          auVar121 = vmulps_avx512vl(auVar115,auVar115);
          auVar200._0_4_ = auVar121._0_4_ + auVar117._0_4_;
          auVar200._4_4_ = auVar121._4_4_ + auVar117._4_4_;
          auVar200._8_4_ = auVar121._8_4_ + auVar117._8_4_;
          auVar200._12_4_ = auVar121._12_4_ + auVar117._12_4_;
          auVar117 = vrsqrt14ps_avx512vl(auVar200);
          fVar64 = auVar117._0_4_;
          fVar65 = auVar117._4_4_;
          fVar66 = auVar117._8_4_;
          fVar67 = auVar117._12_4_;
          auVar201._0_4_ = fVar64 * fVar64 * fVar64 * auVar200._0_4_ * -0.5;
          auVar201._4_4_ = fVar65 * fVar65 * fVar65 * auVar200._4_4_ * -0.5;
          auVar201._8_4_ = fVar66 * fVar66 * fVar66 * auVar200._8_4_ * -0.5;
          auVar201._12_4_ = fVar67 * fVar67 * fVar67 * auVar200._12_4_ * -0.5;
          auVar238._8_4_ = 0x3fc00000;
          auVar238._0_8_ = 0x3fc000003fc00000;
          auVar238._12_4_ = 0x3fc00000;
          auVar117 = vfmadd231ps_fma(auVar201,auVar238,auVar117);
          auVar187._0_4_ = auVar113._0_4_ * auVar117._0_4_;
          auVar187._4_4_ = auVar113._4_4_ * auVar117._4_4_;
          auVar187._8_4_ = auVar113._8_4_ * auVar117._8_4_;
          auVar187._12_4_ = auVar113._12_4_ * auVar117._12_4_;
          auVar219._0_4_ = auVar116._0_4_ * auVar117._0_4_;
          auVar219._4_4_ = auVar116._4_4_ * auVar117._4_4_;
          auVar219._8_4_ = auVar116._8_4_ * auVar117._8_4_;
          auVar219._12_4_ = auVar116._12_4_ * auVar117._12_4_;
          auVar113 = vmulps_avx512vl(auVar114,auVar117);
          auVar117 = vmulps_avx512vl(auVar115,auVar117);
          auVar114 = vxorps_avx512vl(auVar128,auVar118);
          bVar7 = (bool)((byte)uVar62 & 1);
          auVar133._0_4_ = (uint)bVar7 * auVar114._0_4_ | !bVar7 * auVar128._0_4_;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar7 * auVar114._4_4_ | !bVar7 * auVar128._4_4_;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar7 * auVar114._8_4_ | !bVar7 * auVar128._8_4_;
          bVar7 = SUB81(uVar62 >> 3,0);
          auVar133._12_4_ = (uint)bVar7 * auVar114._12_4_ | !bVar7 * auVar128._12_4_;
          auVar114 = vxorps_avx512vl(auVar127,auVar118);
          bVar7 = (bool)((byte)uVar61 & 1);
          auVar134._0_4_ = bVar7 * auVar127._0_4_ | (uint)!bVar7 * auVar114._0_4_;
          bVar7 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar134._4_4_ = bVar7 * auVar127._4_4_ | (uint)!bVar7 * auVar114._4_4_;
          bVar7 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar134._8_4_ = bVar7 * auVar127._8_4_ | (uint)!bVar7 * auVar114._8_4_;
          bVar7 = SUB81(uVar61 >> 3,0);
          auVar134._12_4_ = bVar7 * auVar127._12_4_ | (uint)!bVar7 * auVar114._12_4_;
          auVar114 = vmulps_avx512vl(auVar187,auVar134);
          auVar115 = vmulps_avx512vl(auVar219,auVar134);
          auVar113 = vmulps_avx512vl(auVar113,auVar134);
          auVar117 = vmulps_avx512vl(auVar117,auVar134);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar133,auVar68);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar133,auVar90);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar133,auVar84);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar96,auVar133);
          auVar116 = vsubps_avx512vl(auVar129,auVar68);
          auVar116 = vfmadd213ps_avx512vl(auVar116,auVar85,auVar68);
          auVar68 = vsubps_avx512vl(auVar130,auVar90);
          auVar68 = vfmadd213ps_fma(auVar68,auVar85,auVar90);
          auVar90 = vsubps_avx512vl(auVar131,auVar84);
          auVar84 = vfmadd213ps_fma(auVar90,auVar85,auVar84);
          auVar90 = vsubps_avx512vl(auVar132,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar90,auVar85,auVar96);
          auVar312._0_4_ =
               auVar96._0_4_ * auVar96._0_4_ +
               auVar84._0_4_ * auVar84._0_4_ +
               auVar116._0_4_ * auVar116._0_4_ + auVar68._0_4_ * auVar68._0_4_;
          auVar312._4_4_ =
               auVar96._4_4_ * auVar96._4_4_ +
               auVar84._4_4_ * auVar84._4_4_ +
               auVar116._4_4_ * auVar116._4_4_ + auVar68._4_4_ * auVar68._4_4_;
          auVar312._8_4_ =
               auVar96._8_4_ * auVar96._8_4_ +
               auVar84._8_4_ * auVar84._8_4_ +
               auVar116._8_4_ * auVar116._8_4_ + auVar68._8_4_ * auVar68._8_4_;
          auVar312._12_4_ =
               auVar96._12_4_ * auVar96._12_4_ +
               auVar84._12_4_ * auVar84._12_4_ +
               auVar116._12_4_ * auVar116._12_4_ + auVar68._12_4_ * auVar68._12_4_;
          auVar90 = vrsqrt14ps_avx512vl(auVar312);
          fVar64 = auVar90._0_4_;
          fVar65 = auVar90._4_4_;
          fVar66 = auVar90._8_4_;
          fVar67 = auVar90._12_4_;
          auVar291._0_4_ = fVar64 * fVar64 * fVar64 * auVar312._0_4_ * -0.5;
          auVar291._4_4_ = fVar65 * fVar65 * fVar65 * auVar312._4_4_ * -0.5;
          auVar291._8_4_ = fVar66 * fVar66 * fVar66 * auVar312._8_4_ * -0.5;
          auVar291._12_4_ = fVar67 * fVar67 * fVar67 * auVar312._12_4_ * -0.5;
          auVar90 = vfmadd231ps_fma(auVar291,auVar90,auVar238);
          auVar34._8_4_ = 0x3f7fdf3b;
          auVar34._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar34._12_4_ = 0x3f7fdf3b;
          uVar56 = vcmpps_avx512vl(auVar119,auVar34,6);
          auVar118 = vbroadcastss_avx512vl(auVar97);
          auVar116 = vmulps_avx512vl(auVar116,auVar90);
          bVar54 = (byte)uVar56;
          auVar135._0_4_ =
               (uint)(bVar54 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar114._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar7 * auVar116._4_4_ | (uint)!bVar7 * auVar114._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar7 * auVar116._8_4_ | (uint)!bVar7 * auVar114._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar7 * auVar116._12_4_ | (uint)!bVar7 * auVar114._12_4_;
          auVar114 = vshufps_avx512vl(auVar97,auVar97,0x55);
          auVar97 = vshufps_avx512vl(auVar97,auVar97,0xaa);
          auVar68 = vmulps_avx512vl(auVar68,auVar90);
          auVar136._0_4_ =
               (uint)(bVar54 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar115._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar7 * auVar68._4_4_ | (uint)!bVar7 * auVar115._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar7 * auVar68._8_4_ | (uint)!bVar7 * auVar115._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar7 * auVar68._12_4_ | (uint)!bVar7 * auVar115._12_4_;
          auVar68 = vbroadcastss_avx512vl(auVar69);
          auVar84 = vmulps_avx512vl(auVar84,auVar90);
          auVar137._0_4_ =
               (uint)(bVar54 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar113._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * auVar113._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * auVar113._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar7 * auVar84._12_4_ | (uint)!bVar7 * auVar113._12_4_;
          auVar84 = vshufps_avx512vl(auVar69,auVar69,0x55);
          auVar69 = vshufps_avx512vl(auVar69,auVar69,0xaa);
          auVar90 = vmulps_avx512vl(auVar96,auVar90);
          auVar138._0_4_ =
               (uint)(bVar54 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar117._0_4_;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar7 * auVar90._4_4_ | (uint)!bVar7 * auVar117._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar7 * auVar90._8_4_ | (uint)!bVar7 * auVar117._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar7 * auVar90._12_4_ | (uint)!bVar7 * auVar117._12_4_;
          auVar90 = vbroadcastss_avx512vl(auVar70);
          auVar96 = vshufps_avx512vl(auVar70,auVar70,0x55);
          auVar70 = vshufps_avx512vl(auVar70,auVar70,0xaa);
          auVar117 = vsubps_avx512vl(auVar120,auVar85);
          auVar239._0_4_ = fVar163 * auVar118._0_4_;
          auVar239._4_4_ = fVar174 * auVar118._4_4_;
          auVar239._8_4_ = fVar175 * auVar118._8_4_;
          auVar239._12_4_ = fVar176 * auVar118._12_4_;
          auVar113 = vfmadd213ps_avx512vl(local_158,auVar117,auVar239);
          auVar115 = vbroadcastss_avx512vl(auVar89);
          auVar188._0_4_ = fVar163 * auVar114._0_4_;
          auVar188._4_4_ = fVar174 * auVar114._4_4_;
          auVar188._8_4_ = fVar175 * auVar114._8_4_;
          auVar188._12_4_ = fVar176 * auVar114._12_4_;
          auVar86 = vfmadd213ps_avx512vl(auVar86,auVar117,auVar188);
          auVar114 = vshufps_avx512vl(auVar89,auVar89,0x55);
          auVar89 = vshufps_avx512vl(auVar89,auVar89,0xaa);
          auVar313._0_4_ = auVar97._0_4_ * fVar163;
          auVar313._4_4_ = auVar97._4_4_ * fVar174;
          auVar313._8_4_ = auVar97._8_4_ * fVar175;
          auVar313._12_4_ = auVar97._12_4_ * fVar176;
          auVar87 = vfmadd213ps_avx512vl(auVar87,auVar117,auVar313);
          auVar202._0_4_ = fVar163 * auVar68._0_4_;
          auVar202._4_4_ = fVar174 * auVar68._4_4_;
          auVar202._8_4_ = fVar175 * auVar68._8_4_;
          auVar202._12_4_ = fVar176 * auVar68._12_4_;
          auVar220._0_4_ = fVar163 * auVar84._0_4_;
          auVar220._4_4_ = fVar174 * auVar84._4_4_;
          auVar220._8_4_ = fVar175 * auVar84._8_4_;
          auVar220._12_4_ = fVar176 * auVar84._12_4_;
          auVar314._0_4_ = auVar69._0_4_ * fVar163;
          auVar314._4_4_ = auVar69._4_4_ * fVar174;
          auVar314._8_4_ = auVar69._8_4_ * fVar175;
          auVar314._12_4_ = auVar69._12_4_ * fVar176;
          auVar68 = vfmadd213ps_avx512vl(local_138,auVar117,auVar202);
          auVar97 = vfmadd213ps_avx512vl(auVar91,auVar117,auVar220);
          auVar69 = vfmadd213ps_avx512vl(auVar92,auVar117,auVar314);
          auVar203._0_4_ = auVar90._0_4_ * fVar163;
          auVar203._4_4_ = auVar90._4_4_ * fVar174;
          auVar203._8_4_ = auVar90._8_4_ * fVar175;
          auVar203._12_4_ = auVar90._12_4_ * fVar176;
          auVar221._0_4_ = auVar96._0_4_ * fVar163;
          auVar221._4_4_ = auVar96._4_4_ * fVar174;
          auVar221._8_4_ = auVar96._8_4_ * fVar175;
          auVar221._12_4_ = auVar96._12_4_ * fVar176;
          auVar292._0_4_ = auVar70._0_4_ * fVar163;
          auVar292._4_4_ = auVar70._4_4_ * fVar174;
          auVar292._8_4_ = auVar70._8_4_ * fVar175;
          auVar292._12_4_ = auVar70._12_4_ * fVar176;
          auVar70 = vfmadd213ps_avx512vl(local_148,auVar117,auVar203);
          auVar90 = vfmadd213ps_avx512vl(auVar93,auVar117,auVar221);
          auVar91 = vfmadd213ps_avx512vl(auVar94,auVar117,auVar292);
          auVar204._0_4_ = fVar163 * auVar115._0_4_;
          auVar204._4_4_ = fVar174 * auVar115._4_4_;
          auVar204._8_4_ = fVar175 * auVar115._8_4_;
          auVar204._12_4_ = fVar176 * auVar115._12_4_;
          auVar189._0_4_ = fVar163 * auVar114._0_4_;
          auVar189._4_4_ = fVar174 * auVar114._4_4_;
          auVar189._8_4_ = fVar175 * auVar114._8_4_;
          auVar189._12_4_ = fVar176 * auVar114._12_4_;
          auVar84 = vmulps_avx512vl(auVar85,auVar89);
          auVar89 = vfmadd213ps_avx512vl(local_168,auVar117,auVar204);
          auVar88 = vfmadd213ps_avx512vl(auVar88,auVar117,auVar189);
          auVar92 = vfmadd213ps_avx512vl(auVar95,auVar117,auVar84);
          auVar85 = vmulps_avx512vl(auVar135,auVar135);
          auVar93 = vmulps_avx512vl(auVar136,auVar136);
          auVar168._0_4_ = auVar85._0_4_ + auVar93._0_4_;
          auVar168._4_4_ = auVar85._4_4_ + auVar93._4_4_;
          auVar168._8_4_ = auVar85._8_4_ + auVar93._8_4_;
          auVar168._12_4_ = auVar85._12_4_ + auVar93._12_4_;
          auVar94 = vmulps_avx512vl(auVar137,auVar137);
          auVar84 = vsubps_avx(auVar168,auVar94);
          auVar95 = vmulps_avx512vl(auVar138,auVar138);
          auVar96 = vsubps_avx512vl(auVar84,auVar95);
          auVar84 = vmulps_avx512vl(auVar136,auVar137);
          auVar117 = vmulps_avx512vl(auVar135,auVar138);
          fVar163 = auVar84._0_4_ + auVar117._0_4_;
          fVar174 = auVar84._4_4_ + auVar117._4_4_;
          fVar175 = auVar84._8_4_ + auVar117._8_4_;
          fVar176 = auVar84._12_4_ + auVar117._12_4_;
          auVar169._0_4_ = fVar163 + fVar163;
          auVar169._4_4_ = fVar174 + fVar174;
          auVar169._8_4_ = fVar175 + fVar175;
          auVar169._12_4_ = fVar176 + fVar176;
          auVar114 = vmulps_avx512vl(auVar136,auVar138);
          auVar115 = vmulps_avx512vl(auVar135,auVar137);
          auVar116 = vsubps_avx512vl(auVar114,auVar115);
          auVar116 = vaddps_avx512vl(auVar116,auVar116);
          auVar84 = vsubps_avx(auVar84,auVar117);
          auVar293._0_4_ = auVar84._0_4_ + auVar84._0_4_;
          auVar293._4_4_ = auVar84._4_4_ + auVar84._4_4_;
          auVar293._8_4_ = auVar84._8_4_ + auVar84._8_4_;
          auVar293._12_4_ = auVar84._12_4_ + auVar84._12_4_;
          auVar84 = vsubps_avx(auVar85,auVar93);
          auVar205._0_4_ = auVar94._0_4_ + auVar84._0_4_;
          auVar205._4_4_ = auVar94._4_4_ + auVar84._4_4_;
          auVar205._8_4_ = auVar94._8_4_ + auVar84._8_4_;
          auVar205._12_4_ = auVar94._12_4_ + auVar84._12_4_;
          auVar93 = vsubps_avx512vl(auVar205,auVar95);
          auVar85 = vmulps_avx512vl(auVar137,auVar138);
          auVar117 = vmulps_avx512vl(auVar135,auVar136);
          auVar118 = vaddps_avx512vl(auVar85,auVar117);
          auVar119 = vaddps_avx512vl(auVar118,auVar118);
          fVar163 = auVar114._0_4_ + auVar115._0_4_;
          fVar174 = auVar114._4_4_ + auVar115._4_4_;
          fVar175 = auVar114._8_4_ + auVar115._8_4_;
          fVar176 = auVar114._12_4_ + auVar115._12_4_;
          auVar315._0_4_ = fVar163 + fVar163;
          auVar315._4_4_ = fVar174 + fVar174;
          auVar315._8_4_ = fVar175 + fVar175;
          auVar315._12_4_ = fVar176 + fVar176;
          auVar85 = vsubps_avx(auVar85,auVar117);
          auVar85 = vaddps_avx512vl(auVar85,auVar85);
          auVar84 = vsubps_avx(auVar84,auVar94);
          auVar190._0_4_ = auVar95._0_4_ + auVar84._0_4_;
          auVar190._4_4_ = auVar95._4_4_ + auVar84._4_4_;
          auVar190._8_4_ = auVar95._8_4_ + auVar84._8_4_;
          auVar190._12_4_ = auVar95._12_4_ + auVar84._12_4_;
          auVar84 = vmulps_avx512vl(auVar116,auVar139);
          auVar94 = vxorps_avx512vl(auVar118,auVar118);
          auVar94 = vfmadd213ps_avx512vl(auVar94,auVar169,auVar84);
          auVar326._0_4_ = auVar169._0_4_ + auVar84._0_4_;
          auVar326._4_4_ = auVar169._4_4_ + auVar84._4_4_;
          auVar326._8_4_ = auVar169._8_4_ + auVar84._8_4_;
          auVar326._12_4_ = auVar169._12_4_ + auVar84._12_4_;
          auVar84 = vfmadd213ps_avx512vl(auVar169,auVar139,auVar116);
          auVar95 = vfmadd231ps_avx512vl(auVar326,auVar96,auVar139);
          auVar117 = vfmadd231ps_avx512vl(auVar84,auVar139,auVar96);
          auVar84 = vmulps_avx512vl(auVar119,auVar139);
          auVar114 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar93,auVar84);
          auVar84 = vaddps_avx512vl(auVar93,auVar84);
          auVar93 = vfmadd213ps_avx512vl(auVar93,auVar139,auVar119);
          auVar114 = vaddps_avx512vl(auVar293,auVar114);
          auVar115 = vfmadd231ps_avx512vl(auVar84,auVar293,auVar139);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar139,auVar293);
          auVar206._0_4_ = auVar190._0_4_ * 0.0;
          auVar206._4_4_ = auVar190._4_4_ * 0.0;
          auVar206._8_4_ = auVar190._8_4_ * 0.0;
          auVar206._12_4_ = auVar190._12_4_ * 0.0;
          auVar84 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar85,auVar206);
          auVar116 = vaddps_avx512vl(auVar85,auVar206);
          auVar85 = vfmadd213ps_avx512vl(auVar85,auVar139,auVar190);
          auVar191._0_4_ = auVar315._0_4_ + auVar84._0_4_;
          auVar191._4_4_ = auVar315._4_4_ + auVar84._4_4_;
          auVar191._8_4_ = auVar315._8_4_ + auVar84._8_4_;
          auVar191._12_4_ = auVar315._12_4_ + auVar84._12_4_;
          auVar84 = vfmadd231ps_fma(auVar116,auVar315,auVar139);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar139,auVar315);
          auVar116 = vaddps_avx512vl(auVar86,auVar139);
          auVar118 = vaddps_avx512vl(auVar87,auVar139);
          auVar69 = vaddps_avx512vl(auVar69,auVar139);
          auVar86 = vmulps_avx512vl(auVar191,auVar139);
          fVar163 = auVar84._0_4_;
          auVar303._0_4_ = fVar163 * 0.0;
          fVar174 = auVar84._4_4_;
          auVar303._4_4_ = fVar174 * 0.0;
          fVar175 = auVar84._8_4_;
          auVar303._8_4_ = fVar175 * 0.0;
          fVar176 = auVar84._12_4_;
          auVar303._12_4_ = fVar176 * 0.0;
          auVar84 = vmulps_avx512vl(auVar85,auVar139);
          auVar87 = vfmadd213ps_avx512vl(ZEXT416(0) << 0x20,auVar114,auVar86);
          auVar119 = vfmadd213ps_avx512vl(ZEXT416(0) << 0x20,auVar115,auVar303);
          auVar120 = vfmadd213ps_avx512vl(auVar139,auVar93,auVar84);
          auVar121 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar114);
          auVar122 = vfmadd231ps_avx512vl(auVar303,auVar97,auVar115);
          auVar97 = vfmadd213ps_avx512vl(auVar97,auVar93,auVar84);
          auVar222._0_4_ = auVar91._0_4_ * auVar191._0_4_;
          auVar222._4_4_ = auVar91._4_4_ * auVar191._4_4_;
          auVar222._8_4_ = auVar91._8_4_ * auVar191._8_4_;
          auVar222._12_4_ = auVar91._12_4_ * auVar191._12_4_;
          auVar240._0_4_ = auVar91._0_4_ * fVar163;
          auVar240._4_4_ = auVar91._4_4_ * fVar174;
          auVar240._8_4_ = auVar91._8_4_ * fVar175;
          auVar240._12_4_ = auVar91._12_4_ * fVar176;
          auVar84 = vmulps_avx512vl(auVar91,auVar85);
          auVar91 = vfmadd231ps_avx512vl(auVar222,auVar90,auVar114);
          auVar124 = vfmadd231ps_avx512vl(auVar240,auVar90,auVar115);
          auVar90 = vfmadd231ps_avx512vl(auVar84,auVar93,auVar90);
          auVar192._0_4_ = auVar92._0_4_ * auVar191._0_4_;
          auVar192._4_4_ = auVar92._4_4_ * auVar191._4_4_;
          auVar192._8_4_ = auVar92._8_4_ * auVar191._8_4_;
          auVar192._12_4_ = auVar92._12_4_ * auVar191._12_4_;
          auVar207._0_4_ = auVar92._0_4_ * fVar163;
          auVar207._4_4_ = auVar92._4_4_ * fVar174;
          auVar207._8_4_ = auVar92._8_4_ * fVar175;
          auVar207._12_4_ = auVar92._12_4_ * fVar176;
          auVar84 = vmulps_avx512vl(auVar92,auVar85);
          auVar92 = vfmadd231ps_avx512vl(auVar192,auVar88,auVar114);
          auVar114 = vfmadd231ps_avx512vl(auVar207,auVar88,auVar115);
          auVar93 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar93);
          auVar94 = vaddps_avx512vl(auVar96,auVar94);
          auVar84 = vfmadd231ps_fma(auVar87,auVar113,auVar94);
          auVar85 = vfmadd231ps_fma(auVar119,auVar113,auVar95);
          auVar86 = vfmadd231ps_fma(auVar120,auVar117,auVar113);
          auVar96 = vfmadd231ps_avx512vl(auVar121,auVar68,auVar94);
          auVar113 = vfmadd231ps_avx512vl(auVar122,auVar68,auVar95);
          auVar115 = vfmadd231ps_avx512vl(auVar97,auVar117,auVar68);
          auVar87 = vfmadd231ps_fma(auVar91,auVar70,auVar94);
          auVar88 = vfmadd231ps_fma(auVar124,auVar70,auVar95);
          auVar68 = vfmadd231ps_fma(auVar90,auVar117,auVar70);
          auVar97 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar94);
          auVar92 = vaddps_avx512vl(auVar116,auVar97);
          auVar97 = vfmadd231ps_avx512vl(auVar114,auVar89,auVar95);
          auVar94 = vaddps_avx512vl(auVar118,auVar97);
          auVar97 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar117);
          auVar93 = vaddps_avx512vl(auVar69,auVar97);
          auVar170._0_4_ = auVar88._0_4_ * auVar115._0_4_;
          auVar170._4_4_ = auVar88._4_4_ * auVar115._4_4_;
          auVar170._8_4_ = auVar88._8_4_ * auVar115._8_4_;
          auVar170._12_4_ = auVar88._12_4_ * auVar115._12_4_;
          auVar97 = vfmsub231ps_fma(auVar170,auVar113,auVar68);
          auVar69 = vmulps_avx512vl(auVar68,auVar96);
          auVar69 = vfmsub231ps_fma(auVar69,auVar115,auVar87);
          auVar251._0_4_ = auVar113._0_4_ * auVar87._0_4_;
          auVar251._4_4_ = auVar113._4_4_ * auVar87._4_4_;
          auVar251._8_4_ = auVar113._8_4_ * auVar87._8_4_;
          auVar251._12_4_ = auVar113._12_4_ * auVar87._12_4_;
          auVar95 = vfmsub231ps_avx512vl(auVar251,auVar96,auVar88);
          fVar163 = auVar86._0_4_;
          auVar258._0_4_ = fVar163 * auVar87._0_4_;
          fVar174 = auVar86._4_4_;
          auVar258._4_4_ = fVar174 * auVar87._4_4_;
          fVar175 = auVar86._8_4_;
          auVar258._8_4_ = fVar175 * auVar87._8_4_;
          fVar176 = auVar86._12_4_;
          auVar258._12_4_ = fVar176 * auVar87._12_4_;
          auVar89 = vfmsub231ps_fma(auVar258,auVar84,auVar68);
          auVar193._0_4_ = auVar85._0_4_ * auVar68._0_4_;
          auVar193._4_4_ = auVar85._4_4_ * auVar68._4_4_;
          auVar193._8_4_ = auVar85._8_4_ * auVar68._8_4_;
          auVar193._12_4_ = auVar85._12_4_ * auVar68._12_4_;
          auVar68 = vfmsub231ps_fma(auVar193,auVar88,auVar86);
          auVar268._0_4_ = auVar84._0_4_ * auVar88._0_4_;
          auVar268._4_4_ = auVar84._4_4_ * auVar88._4_4_;
          auVar268._8_4_ = auVar84._8_4_ * auVar88._8_4_;
          auVar268._12_4_ = auVar84._12_4_ * auVar88._12_4_;
          auVar90 = vfmsub231ps_fma(auVar268,auVar85,auVar87);
          auVar223._0_4_ = auVar113._0_4_ * fVar163;
          auVar223._4_4_ = auVar113._4_4_ * fVar174;
          auVar223._8_4_ = auVar113._8_4_ * fVar175;
          auVar223._12_4_ = auVar113._12_4_ * fVar176;
          auVar87 = vfmsub231ps_fma(auVar223,auVar85,auVar115);
          auVar241._0_4_ = auVar84._0_4_ * auVar115._0_4_;
          auVar241._4_4_ = auVar84._4_4_ * auVar115._4_4_;
          auVar241._8_4_ = auVar84._8_4_ * auVar115._8_4_;
          auVar241._12_4_ = auVar84._12_4_ * auVar115._12_4_;
          auVar117 = vfmsub231ps_avx512vl(auVar241,auVar86,auVar96);
          auVar86 = vmulps_avx512vl(auVar96,auVar85);
          auVar91 = vfmsub231ps_fma(auVar86,auVar84,auVar113);
          auVar304._0_4_ = fVar163 * auVar95._0_4_;
          auVar304._4_4_ = fVar174 * auVar95._4_4_;
          auVar304._8_4_ = fVar175 * auVar95._8_4_;
          auVar304._12_4_ = fVar176 * auVar95._12_4_;
          auVar85 = vfmadd231ps_fma(auVar304,auVar69,auVar85);
          auVar70 = vfmadd231ps_fma(auVar85,auVar97,auVar84);
          auVar84 = vdivps_avx(auVar97,auVar70);
          auVar85 = vdivps_avx(auVar68,auVar70);
          auVar86 = vdivps_avx(auVar87,auVar70);
          auVar87 = vdivps_avx(auVar69,auVar70);
          auVar88 = vdivps_avx(auVar89,auVar70);
          auVar68 = vdivps_avx(auVar117,auVar70);
          auVar97 = vdivps_avx(auVar95,auVar70);
          auVar69 = vdivps_avx(auVar90,auVar70);
          auVar70 = vdivps_avx(auVar91,auVar70);
          auVar89 = vmulps_avx512vl(auVar93,auVar97);
          auVar90 = vmulps_avx512vl(auVar93,auVar69);
          auVar91 = vmulps_avx512vl(auVar93,auVar70);
          auVar89 = vfmadd231ps_fma(auVar89,auVar94,auVar87);
          auVar90 = vfmadd231ps_fma(auVar90,auVar94,auVar88);
          auVar91 = vfmadd231ps_fma(auVar91,auVar68,auVar94);
          auVar89 = vfmadd231ps_fma(auVar89,auVar92,auVar84);
          auVar90 = vfmadd231ps_fma(auVar90,auVar92,auVar85);
          auVar91 = vfmadd231ps_fma(auVar91,auVar86,auVar92);
        }
        else {
          uVar63 = uVar55;
          do {
            uVar152 = 0;
            for (uVar57 = uVar63 & 0xff; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
              uVar152 = uVar152 + 1;
            }
            plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                             (long)*(int *)(local_a8 + (ulong)uVar152 * 4) * 0x38);
            iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_a8 + (ulong)uVar152 * 4) * 0x38);
            auVar214 = SUB1612(ZEXT816(0),0);
            if (iVar3 == 0x9134) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
              in_ZMM5 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
              in_ZMM8 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
              in_ZMM10 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
              in_ZMM11 = ZEXT1664(auVar86);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              auVar88._8_8_ = 0;
              auVar88._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
              auVar68._8_8_ = 0;
              auVar68._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,auVar88)
              ;
              in_ZMM5 = ZEXT1664(auVar86);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                           auVar68);
              in_ZMM8 = ZEXT1664(auVar86);
              auVar97._8_8_ = 0;
              auVar97._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                           auVar97);
              in_ZMM10 = ZEXT1664(auVar86);
              auVar69._8_8_ = 0;
              auVar69._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                           auVar69);
              in_ZMM11 = ZEXT1664(auVar86);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              auVar88 = vinsertps_avx512f(auVar70,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
              local_88 = ZEXT416(*(uint *)(lVar6 + 0xc + lVar58));
              auVar68 = vpermt2ps_avx512vl(auVar89,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58)))
              ;
              auVar92._8_8_ = 0;
              auVar92._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar97 = vpermt2ps_avx512vl(auVar92,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
              fVar64 = *(float *)(lVar6 + 0x24 + lVar58);
              fVar65 = *(float *)(lVar6 + 0x28 + lVar58);
              fVar66 = *(float *)(lVar6 + 0x2c + lVar58);
              fVar67 = *(float *)(lVar6 + 0x30 + lVar58);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * fVar65)),ZEXT416((uint)fVar64),
                                        ZEXT416((uint)fVar64));
              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
              auVar91._4_12_ = auVar214;
              auVar91._0_4_ = auVar86._0_4_;
              auVar69 = vrsqrt14ss_avx512f(auVar87,auVar91);
              auVar70 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              fVar257 = auVar69._0_4_;
              auVar86 = vaddss_avx512f(auVar70,ZEXT416((uint)(fVar257 * fVar257 *
                                                             fVar257 * auVar86._0_4_ * -0.5)));
              fVar257 = auVar86._0_4_;
              auVar86 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar64 * fVar257)),0x30);
              in_ZMM11 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar65 * fVar257)),0x30);
              in_ZMM5 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx512f(auVar88,ZEXT416((uint)(fVar67 * fVar257)),0x30);
              in_ZMM10 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(local_88,ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
              auVar86 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar66 * fVar257)),0x30);
              in_ZMM8 = ZEXT1664(auVar86);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar58));
              in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar58));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar58));
              in_ZMM11 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar58));
            }
            auVar86 = vpbroadcastd_avx512vl();
            uVar14 = vpcmpeqd_avx512vl(auVar86,local_a8);
            iVar3 = (int)plVar1[0xb];
            if (iVar3 == 0x9134) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
              in_ZMM4 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
              in_ZMM6 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
              in_ZMM7 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
              in_ZMM9 = ZEXT1664(auVar86);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
              auVar94._8_8_ = 0;
              auVar94._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,auVar93)
              ;
              in_ZMM4 = ZEXT1664(auVar86);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                           auVar94);
              in_ZMM6 = ZEXT1664(auVar86);
              auVar95._8_8_ = 0;
              auVar95._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                           auVar95);
              in_ZMM7 = ZEXT1664(auVar86);
              auVar96._8_8_ = 0;
              auVar96._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
              auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                           auVar96);
              in_ZMM9 = ZEXT1664(auVar86);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              auVar113._8_8_ = 0;
              auVar113._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              local_88 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
              auVar114._8_8_ = 0;
              auVar114._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
              auVar88 = vpermt2ps_avx512vl(auVar114,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58))
                                          );
              auVar115._8_8_ = 0;
              auVar115._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar86 = vpermt2ps_avx512vl(auVar115,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
              fVar64 = *(float *)(lVar6 + 0x24 + lVar58);
              fVar65 = *(float *)(lVar6 + 0x28 + lVar58);
              fVar66 = *(float *)(lVar6 + 0x2c + lVar58);
              fVar67 = *(float *)(lVar6 + 0x30 + lVar58);
              auVar68 = vmulss_avx512f(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
              auVar117._4_12_ = auVar214;
              auVar117._0_4_ = auVar68._0_4_;
              auVar97 = vrsqrt14ss_avx512f(auVar87,auVar117);
              auVar69 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
              auVar68 = vmulss_avx512f(auVar68,ZEXT416(0xbf000000));
              auVar68 = vmulss_avx512f(auVar97,auVar68);
              auVar68 = vmulss_avx512f(ZEXT416((uint)(auVar97._0_4_ * auVar97._0_4_)),auVar68);
              auVar68 = vaddss_avx512f(auVar69,auVar68);
              fVar257 = auVar68._0_4_;
              auVar86 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar64 * fVar257)),0x30);
              in_ZMM9 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(auVar88,ZEXT416((uint)(fVar65 * fVar257)),0x30);
              in_ZMM4 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(local_88,ZEXT416((uint)(fVar67 * fVar257)),0x30);
              in_ZMM7 = ZEXT1664(auVar86);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                      ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
              auVar86 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar66 * fVar257)),0x30);
              in_ZMM6 = ZEXT1664(auVar86);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar58));
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar58));
              in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar58));
              in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar58));
            }
            bVar60 = (byte)uVar63 & (byte)uVar14 & 0xf;
            bVar54 = ~bVar60 & (byte)uVar63;
            uVar63 = (uint)bVar54;
            auVar88 = in_ZMM5._0_16_;
            auVar86 = vbroadcastss_avx512vl(auVar88);
            auVar116._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM18._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar116._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM18._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar116._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM18._8_4_;
            auVar116._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM18._12_4_
            ;
            in_ZMM18 = ZEXT1664(auVar116);
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0x55);
            auVar118._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM19._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar118._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar118._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
            auVar118._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM19._12_4_
            ;
            in_ZMM19 = ZEXT1664(auVar118);
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xaa);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_108._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_108._4_4_;
            local_108._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_108._0_4_;
            local_108._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_108._8_4_;
            local_108._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_108._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xff);
            auVar119._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM27._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar119._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM27._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar119._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM27._8_4_;
            auVar119._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM27._12_4_
            ;
            in_ZMM27 = ZEXT1664(auVar119);
            auVar88 = in_ZMM8._0_16_;
            auVar86 = vbroadcastss_avx512vl(auVar88);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_118._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_118._4_4_;
            local_118._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_118._0_4_;
            local_118._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_118._8_4_;
            local_118._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_118._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0x55);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_158._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_158._4_4_;
            local_158._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_158._0_4_;
            local_158._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_158._8_4_;
            local_158._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_158._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xaa);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_f8._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_f8._4_4_;
            local_f8._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_f8._0_4_;
            local_f8._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_f8._8_4_;
            local_f8._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * local_f8._12_4_
            ;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xff);
            auVar120._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM25._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar120._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM25._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar120._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM25._8_4_;
            auVar120._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM25._12_4_
            ;
            in_ZMM25 = ZEXT1664(auVar120);
            auVar88 = in_ZMM10._0_16_;
            auVar86 = vbroadcastss_avx512vl(auVar88);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_138._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_138._4_4_;
            local_138._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_138._0_4_;
            local_138._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_138._8_4_;
            local_138._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_138._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0x55);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_d8._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_d8._4_4_;
            local_d8._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_d8._0_4_;
            local_d8._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_d8._8_4_;
            local_d8._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * local_d8._12_4_
            ;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xaa);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_e8._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_e8._4_4_;
            local_e8._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_e8._0_4_;
            local_e8._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_e8._8_4_;
            local_e8._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * local_e8._12_4_
            ;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xff);
            auVar121._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM22._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar121._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM22._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar121._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM22._8_4_;
            auVar121._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM22._12_4_
            ;
            in_ZMM22 = ZEXT1664(auVar121);
            auVar88 = in_ZMM11._0_16_;
            auVar86 = vbroadcastss_avx512vl(auVar88);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_168._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_168._4_4_;
            local_168._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_168._0_4_;
            local_168._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_168._8_4_;
            local_168._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_168._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0x55);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_148._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_148._4_4_;
            local_148._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_148._0_4_;
            local_148._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_148._8_4_;
            local_148._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_148._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xaa);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            bVar8 = (bool)(bVar60 >> 2 & 1);
            local_128._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * local_128._4_4_;
            local_128._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * local_128._0_4_;
            local_128._8_4_ = (uint)bVar8 * auVar86._8_4_ | (uint)!bVar8 * local_128._8_4_;
            local_128._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ |
                 (uint)!(bool)(bVar60 >> 3) * local_128._12_4_;
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xff);
            auVar122._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM24._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar122._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM24._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar122._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM24._8_4_;
            auVar122._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM24._12_4_
            ;
            in_ZMM24 = ZEXT1664(auVar122);
            auVar88 = in_ZMM4._0_16_;
            auVar86 = vbroadcastss_avx512vl(auVar88);
            auVar124._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM28._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM28._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM28._8_4_;
            auVar124._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM28._12_4_
            ;
            in_ZMM28 = ZEXT1664(auVar124);
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0x55);
            auVar125._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM26._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM26._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM26._8_4_;
            auVar125._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM26._12_4_
            ;
            in_ZMM26 = ZEXT1664(auVar125);
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xaa);
            auVar126._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM23._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * in_ZMM23._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * in_ZMM23._8_4_;
            auVar126._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM23._12_4_
            ;
            in_ZMM23 = ZEXT1664(auVar126);
            auVar86 = vshufps_avx512vl(auVar88,auVar88,0xff);
            auVar139._0_4_ =
                 (uint)(bVar60 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar84._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * auVar84._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * auVar84._8_4_;
            auVar139._12_4_ =
                 (uint)(bVar60 >> 3) * auVar86._12_4_ | (uint)!(bool)(bVar60 >> 3) * auVar84._12_4_;
            auVar86 = in_ZMM6._0_16_;
            auVar84 = vbroadcastss_avx512vl(auVar86);
            auVar140._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM21._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar140._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM21._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar140._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM21._8_4_;
            auVar140._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM21._12_4_
            ;
            in_ZMM21 = ZEXT1664(auVar140);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0x55);
            auVar141._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM20._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar141._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM20._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar141._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM20._8_4_;
            auVar141._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM20._12_4_
            ;
            in_ZMM20 = ZEXT1664(auVar141);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0xaa);
            local_78 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_78);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_74 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_74);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_70 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_70);
            fStack_6c = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_6c);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0xff);
            auVar142._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM31._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar142._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM31._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar142._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM31._8_4_;
            auVar142._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM31._12_4_
            ;
            in_ZMM31 = ZEXT1664(auVar142);
            auVar86 = in_ZMM7._0_16_;
            auVar84 = vbroadcastss_avx512vl(auVar86);
            local_68 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_68);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_64 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_64);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_60 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_60);
            fStack_5c = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_5c);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0x55);
            local_58 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_58);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_54 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_54);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_50 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_50);
            fStack_4c = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_4c);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0xaa);
            local_48 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_48);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_44 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_44);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_40 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_40);
            fStack_3c = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_3c);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0xff);
            auVar143._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM29._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar143._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM29._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar143._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM29._8_4_;
            auVar143._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM29._12_4_
            ;
            in_ZMM29 = ZEXT1664(auVar143);
            auVar86 = in_ZMM9._0_16_;
            auVar84 = vbroadcastss_avx512vl(auVar86);
            local_38 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_38);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_34 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_34);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_30 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_30);
            fStack_2c = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_2c);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0x55);
            local_b8 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_b8);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_b4 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_b4);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_b0 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_b0);
            fStack_ac = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_ac);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0xaa);
            local_c8 = (float)((uint)(bVar60 & 1) * auVar84._0_4_ |
                              (uint)!(bool)(bVar60 & 1) * (int)local_c8);
            bVar7 = (bool)(bVar60 >> 1 & 1);
            fStack_c4 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fStack_c4);
            bVar7 = (bool)(bVar60 >> 2 & 1);
            fStack_c0 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fStack_c0);
            fStack_bc = (float)((uint)(bVar60 >> 3) * auVar84._12_4_ |
                               (uint)!(bool)(bVar60 >> 3) * (int)fStack_bc);
            auVar84 = vshufps_avx512vl(auVar86,auVar86,0xff);
            auVar144._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM30._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar144._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM30._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar144._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM30._8_4_;
            auVar144._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM30._12_4_
            ;
            in_ZMM30 = ZEXT1664(auVar144);
            auVar84 = auVar139;
          } while (bVar54 != 0);
          auVar84 = vmulps_avx512vl(auVar144,auVar122);
          auVar86 = vmulps_avx512vl(auVar139,auVar119);
          auVar87 = vmulps_avx512vl(auVar142,auVar120);
          auVar88 = vmulps_avx512vl(auVar143,auVar121);
          auVar182._0_4_ = auVar88._0_4_ + auVar87._0_4_ + auVar86._0_4_ + auVar84._0_4_;
          auVar182._4_4_ = auVar88._4_4_ + auVar87._4_4_ + auVar86._4_4_ + auVar84._4_4_;
          auVar182._8_4_ = auVar88._8_4_ + auVar87._8_4_ + auVar86._8_4_ + auVar84._8_4_;
          auVar182._12_4_ = auVar88._12_4_ + auVar87._12_4_ + auVar86._12_4_ + auVar84._12_4_;
          auVar242._8_4_ = 0x80000000;
          auVar242._0_8_ = 0x8000000080000000;
          auVar242._12_4_ = 0x80000000;
          uVar56 = CONCAT44(auVar182._4_4_,auVar182._0_4_);
          auVar208._0_8_ = uVar56 ^ 0x8000000080000000;
          auVar208._8_4_ = -auVar182._8_4_;
          auVar208._12_4_ = -auVar182._12_4_;
          uVar56 = vcmpps_avx512vl(auVar182,auVar208,1);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx512vl(auVar182,auVar185);
          auVar35._8_4_ = 0xbb8d3753;
          auVar35._0_8_ = 0xbb8d3753bb8d3753;
          auVar35._12_4_ = 0xbb8d3753;
          auVar86 = vmulps_avx512vl(auVar84,auVar35);
          auVar36._8_4_ = 0x3c9df1b8;
          auVar36._0_8_ = 0x3c9df1b83c9df1b8;
          auVar36._12_4_ = 0x3c9df1b8;
          auVar86 = vaddps_avx512vl(auVar86,auVar36);
          fVar64 = auVar84._0_4_;
          auVar224._0_4_ = fVar64 * auVar86._0_4_;
          fVar65 = auVar84._4_4_;
          auVar224._4_4_ = fVar65 * auVar86._4_4_;
          fVar66 = auVar84._8_4_;
          auVar224._8_4_ = fVar66 * auVar86._8_4_;
          fVar67 = auVar84._12_4_;
          auVar224._12_4_ = fVar67 * auVar86._12_4_;
          auVar37._8_4_ = 0xbd37e81c;
          auVar37._0_8_ = 0xbd37e81cbd37e81c;
          auVar37._12_4_ = 0xbd37e81c;
          auVar86 = vaddps_avx512vl(auVar224,auVar37);
          auVar225._0_4_ = fVar64 * auVar86._0_4_;
          auVar225._4_4_ = fVar65 * auVar86._4_4_;
          auVar225._8_4_ = fVar66 * auVar86._8_4_;
          auVar225._12_4_ = fVar67 * auVar86._12_4_;
          auVar38._8_4_ = 0x3db3edac;
          auVar38._0_8_ = 0x3db3edac3db3edac;
          auVar38._12_4_ = 0x3db3edac;
          auVar87 = vaddps_avx512vl(auVar225,auVar38);
          auVar86 = vmaxps_avx(auVar208,auVar182);
          auVar183._0_4_ = fVar64 * auVar87._0_4_;
          auVar183._4_4_ = fVar65 * auVar87._4_4_;
          auVar183._8_4_ = fVar66 * auVar87._8_4_;
          auVar183._12_4_ = fVar67 * auVar87._12_4_;
          auVar39._8_4_ = 0xbe5ba881;
          auVar39._0_8_ = 0xbe5ba881be5ba881;
          auVar39._12_4_ = 0xbe5ba881;
          auVar87 = vaddps_avx512vl(auVar183,auVar39);
          auVar209._8_4_ = 0x3f800000;
          auVar209._0_8_ = 0x3f8000003f800000;
          auVar209._12_4_ = 0x3f800000;
          uVar61 = vcmpps_avx512vl(auVar84,auVar209,6);
          auVar184._0_4_ = fVar64 * auVar87._0_4_;
          auVar184._4_4_ = fVar65 * auVar87._4_4_;
          auVar184._8_4_ = fVar66 * auVar87._8_4_;
          auVar184._12_4_ = fVar67 * auVar87._12_4_;
          auVar40._8_4_ = 0x3fc90fd1;
          auVar40._0_8_ = 0x3fc90fd13fc90fd1;
          auVar40._12_4_ = 0x3fc90fd1;
          auVar87 = vaddps_avx512vl(auVar184,auVar40);
          auVar84 = vsubps_avx(auVar209,auVar84);
          auVar84 = vsqrtps_avx(auVar84);
          auVar252._0_4_ = auVar84._0_4_ * auVar87._0_4_;
          auVar252._4_4_ = auVar84._4_4_ * auVar87._4_4_;
          auVar252._8_4_ = auVar84._8_4_ * auVar87._8_4_;
          auVar252._12_4_ = auVar84._12_4_ * auVar87._12_4_;
          auVar185 = ZEXT816(0) << 0x20;
          uVar62 = vcmpps_avx512vl(auVar86,auVar185,1);
          auVar259._8_4_ = 0x3fc90fdb;
          auVar259._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar259._12_4_ = 0x3fc90fdb;
          auVar84 = vsubps_avx(auVar259,auVar252);
          auVar84 = vmaxps_avx(auVar185,auVar84);
          auVar87 = vxorps_avx512vl(auVar84,auVar242);
          bVar7 = (bool)((byte)uVar62 & 1);
          auVar145._0_4_ = (uint)bVar7 * auVar87._0_4_ | (uint)!bVar7 * auVar84._0_4_;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar7 * auVar87._4_4_ | (uint)!bVar7 * auVar84._4_4_;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar7 * auVar87._8_4_ | (uint)!bVar7 * auVar84._8_4_;
          bVar7 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar7 * auVar87._12_4_ | (uint)!bVar7 * auVar84._12_4_;
          auVar84 = vsubps_avx(auVar259,auVar145);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar7 = (bool)((byte)uVar61 & 1);
          bVar8 = (bool)((byte)(uVar61 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar61 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar253._0_4_ =
               fVar163 * (float)((uint)bVar7 * auVar87._0_4_ | (uint)!bVar7 * auVar84._0_4_);
          auVar253._4_4_ =
               fVar174 * (float)((uint)bVar8 * auVar87._4_4_ | (uint)!bVar8 * auVar84._4_4_);
          auVar253._8_4_ =
               fVar175 * (float)((uint)bVar9 * auVar87._8_4_ | (uint)!bVar9 * auVar84._8_4_);
          auVar253._12_4_ =
               fVar176 * (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar84._12_4_);
          auVar41._8_4_ = 0x3f22f983;
          auVar41._0_8_ = 0x3f22f9833f22f983;
          auVar41._12_4_ = 0x3f22f983;
          auVar84 = vmulps_avx512vl(auVar253,auVar41);
          auVar84 = vroundps_avx(auVar84,1);
          auVar260._0_4_ = auVar84._0_4_ * 1.5707964;
          auVar260._4_4_ = auVar84._4_4_ * 1.5707964;
          auVar260._8_4_ = auVar84._8_4_ * 1.5707964;
          auVar260._12_4_ = auVar84._12_4_ * 1.5707964;
          auVar87 = vsubps_avx(auVar253,auVar260);
          auVar84 = vcvtps2dq_avx(auVar84);
          fVar64 = auVar87._0_4_;
          auVar269._0_4_ = fVar64 * fVar64;
          fVar65 = auVar87._4_4_;
          auVar269._4_4_ = fVar65 * fVar65;
          fVar66 = auVar87._8_4_;
          auVar269._8_4_ = fVar66 * fVar66;
          fVar67 = auVar87._12_4_;
          auVar269._12_4_ = fVar67 * fVar67;
          auVar42._8_4_ = 0xb2d70013;
          auVar42._0_8_ = 0xb2d70013b2d70013;
          auVar42._12_4_ = 0xb2d70013;
          auVar87 = vmulps_avx512vl(auVar269,auVar42);
          auVar43._8_4_ = 0x363938a8;
          auVar43._0_8_ = 0x363938a8363938a8;
          auVar43._12_4_ = 0x363938a8;
          auVar87 = vaddps_avx512vl(auVar87,auVar43);
          auVar44._8_4_ = 3;
          auVar44._0_8_ = 0x300000003;
          auVar44._12_4_ = 3;
          auVar88 = vpandd_avx512vl(auVar84,auVar44);
          auVar305._8_4_ = 1;
          auVar305._0_8_ = 0x100000001;
          auVar305._12_4_ = 1;
          auVar45._8_4_ = 0xb48b634d;
          auVar45._0_8_ = 0xb48b634db48b634d;
          auVar45._12_4_ = 0xb48b634d;
          auVar68 = vmulps_avx512vl(auVar269,auVar45);
          uVar62 = vptestnmd_avx512vl(auVar84,auVar305);
          uVar62 = uVar62 & 0xf;
          auVar46._8_4_ = 0x37cfab9c;
          auVar46._0_8_ = 0x37cfab9c37cfab9c;
          auVar46._12_4_ = 0x37cfab9c;
          auVar84 = vaddps_avx512vl(auVar68,auVar46);
          auVar274._0_4_ = auVar269._0_4_ * auVar87._0_4_;
          auVar274._4_4_ = auVar269._4_4_ * auVar87._4_4_;
          auVar274._8_4_ = auVar269._8_4_ * auVar87._8_4_;
          auVar274._12_4_ = auVar269._12_4_ * auVar87._12_4_;
          auVar47._8_4_ = 0xb9501096;
          auVar47._0_8_ = 0xb9501096b9501096;
          auVar47._12_4_ = 0xb9501096;
          auVar87 = vaddps_avx512vl(auVar274,auVar47);
          auVar261._0_4_ = auVar269._0_4_ * auVar84._0_4_;
          auVar261._4_4_ = auVar269._4_4_ * auVar84._4_4_;
          auVar261._8_4_ = auVar269._8_4_ * auVar84._8_4_;
          auVar261._12_4_ = auVar269._12_4_ * auVar84._12_4_;
          auVar48._8_4_ = 0xbab60981;
          auVar48._0_8_ = 0xbab60981bab60981;
          auVar48._12_4_ = 0xbab60981;
          auVar84 = vaddps_avx512vl(auVar261,auVar48);
          auVar275._0_4_ = auVar269._0_4_ * auVar87._0_4_;
          auVar275._4_4_ = auVar269._4_4_ * auVar87._4_4_;
          auVar275._8_4_ = auVar269._8_4_ * auVar87._8_4_;
          auVar275._12_4_ = auVar269._12_4_ * auVar87._12_4_;
          auVar49._8_4_ = 0x3c088898;
          auVar49._0_8_ = 0x3c0888983c088898;
          auVar49._12_4_ = 0x3c088898;
          auVar87 = vaddps_avx512vl(auVar275,auVar49);
          auVar262._0_4_ = auVar269._0_4_ * auVar84._0_4_;
          auVar262._4_4_ = auVar269._4_4_ * auVar84._4_4_;
          auVar262._8_4_ = auVar269._8_4_ * auVar84._8_4_;
          auVar262._12_4_ = auVar269._12_4_ * auVar84._12_4_;
          auVar50._8_4_ = 0x3d2aaaa4;
          auVar50._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar50._12_4_ = 0x3d2aaaa4;
          auVar84 = vaddps_avx512vl(auVar262,auVar50);
          auVar276._0_4_ = auVar269._0_4_ * auVar87._0_4_;
          auVar276._4_4_ = auVar269._4_4_ * auVar87._4_4_;
          auVar276._8_4_ = auVar269._8_4_ * auVar87._8_4_;
          auVar276._12_4_ = auVar269._12_4_ * auVar87._12_4_;
          auVar51._8_4_ = 0xbe2aaaab;
          auVar51._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar51._12_4_ = 0xbe2aaaab;
          auVar87 = vaddps_avx512vl(auVar276,auVar51);
          uVar61 = vpcmpgtd_avx512vl(auVar88,auVar305);
          uVar61 = uVar61 & 0xf;
          fVar257 = auVar269._0_4_ * (auVar269._0_4_ * auVar84._0_4_ + -0.5);
          fVar265 = auVar269._4_4_ * (auVar269._4_4_ * auVar84._4_4_ + -0.5);
          fVar266 = auVar269._8_4_ * (auVar269._8_4_ * auVar84._8_4_ + -0.5);
          fVar267 = auVar269._12_4_ * (auVar269._12_4_ * auVar84._12_4_ + -0.5);
          auVar306._0_4_ = (auVar269._0_4_ * auVar87._0_4_ + 1.0) * fVar64;
          auVar306._4_4_ = (auVar269._4_4_ * auVar87._4_4_ + 1.0) * fVar65;
          auVar306._8_4_ = (auVar269._8_4_ * auVar87._8_4_ + 1.0) * fVar66;
          auVar306._12_4_ = (auVar269._12_4_ * auVar87._12_4_ + 1.0) * fVar67;
          auVar254._0_4_ = fVar257 + 1.0;
          auVar254._4_4_ = fVar265 + 1.0;
          auVar254._8_4_ = fVar266 + 1.0;
          auVar254._12_4_ = fVar267 + 1.0;
          auVar84 = vblendmps_avx512vl(auVar254,auVar306);
          bVar7 = (bool)((byte)uVar62 & 1);
          uVar63 = (uint)bVar7 * auVar84._0_4_ | (uint)!bVar7 * (int)fVar257;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          uVar152 = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * (int)fVar265;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          uVar57 = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * (int)fVar266;
          bVar7 = SUB81(uVar62 >> 3,0);
          uVar158 = (uint)bVar7 * auVar84._12_4_ | (uint)!bVar7 * (int)fVar267;
          bVar7 = (bool)((byte)uVar62 & 1);
          auVar146._0_4_ = (uint)bVar7 * (int)auVar254._0_4_ | (uint)!bVar7 * (int)auVar306._0_4_;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar146._4_4_ = (uint)bVar7 * (int)auVar254._4_4_ | (uint)!bVar7 * (int)auVar306._4_4_;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar146._8_4_ = (uint)bVar7 * (int)auVar254._8_4_ | (uint)!bVar7 * (int)auVar306._8_4_;
          bVar7 = SUB81(uVar62 >> 3,0);
          auVar146._12_4_ = (uint)bVar7 * (int)auVar254._12_4_ | (uint)!bVar7 * (int)auVar306._12_4_
          ;
          auVar84 = vpcmpeqd_avx(auVar254,auVar254);
          auVar84 = vpaddd_avx(auVar88,auVar84);
          auVar52._8_4_ = 2;
          auVar52._0_8_ = 0x200000002;
          auVar52._12_4_ = 2;
          uVar62 = vpcmpud_avx512vl(auVar84,auVar52,1);
          uVar62 = uVar62 & 0xf;
          auVar84 = vxorps_avx512vl(auVar144,auVar242);
          bVar54 = (byte)uVar56;
          auVar147._0_4_ = (uint)(bVar54 & 1) * auVar84._0_4_ | !(bool)(bVar54 & 1) * auVar144._0_4_
          ;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar7 * auVar84._4_4_ | !bVar7 * auVar144._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar7 * auVar84._8_4_ | !bVar7 * auVar144._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar7 * auVar84._12_4_ | !bVar7 * auVar144._12_4_;
          auVar84 = vxorps_avx512vl(auVar139,auVar242);
          auVar148._0_4_ = (uint)(bVar54 & 1) * auVar84._0_4_ | !(bool)(bVar54 & 1) * auVar139._0_4_
          ;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar148._4_4_ = (uint)bVar7 * auVar84._4_4_ | !bVar7 * auVar139._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar148._8_4_ = (uint)bVar7 * auVar84._8_4_ | !bVar7 * auVar139._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar148._12_4_ = (uint)bVar7 * auVar84._12_4_ | !bVar7 * auVar139._12_4_;
          auVar87 = vfmsub213ps_avx512vl(auVar122,auVar86,auVar147);
          auVar84 = vfmsub213ps_fma(auVar119,auVar86,auVar148);
          fVar64 = auVar87._0_4_;
          fVar265 = auVar87._4_4_;
          fVar156 = auVar87._8_4_;
          fVar162 = auVar87._12_4_;
          fVar65 = auVar84._0_4_;
          fVar266 = auVar84._4_4_;
          fVar157 = auVar84._8_4_;
          fVar11 = auVar84._12_4_;
          auVar84 = vxorps_avx512vl(auVar142,auVar242);
          auVar149._0_4_ = (uint)(bVar54 & 1) * auVar84._0_4_ | !(bool)(bVar54 & 1) * auVar142._0_4_
          ;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar149._4_4_ = (uint)bVar7 * auVar84._4_4_ | !bVar7 * auVar142._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar149._8_4_ = (uint)bVar7 * auVar84._8_4_ | !bVar7 * auVar142._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar149._12_4_ = (uint)bVar7 * auVar84._12_4_ | !bVar7 * auVar142._12_4_;
          auVar84 = vfmsub213ps_avx512vl(auVar120,auVar86,auVar149);
          fVar66 = auVar84._0_4_;
          fVar267 = auVar84._4_4_;
          fVar160 = auVar84._8_4_;
          fVar12 = auVar84._12_4_;
          auVar84 = vxorps_avx512vl(auVar143,auVar242);
          auVar150._0_4_ = (uint)(bVar54 & 1) * auVar84._0_4_ | !(bool)(bVar54 & 1) * auVar143._0_4_
          ;
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar7 * auVar84._4_4_ | !bVar7 * auVar143._4_4_;
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar7 * auVar84._8_4_ | !bVar7 * auVar143._8_4_;
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar7 * auVar84._12_4_ | !bVar7 * auVar143._12_4_;
          auVar84 = vfmsub213ps_avx512vl(auVar121,auVar86,auVar150);
          fVar67 = auVar84._0_4_;
          fVar155 = auVar84._4_4_;
          fVar161 = auVar84._8_4_;
          fVar13 = auVar84._12_4_;
          auVar294._0_4_ = fVar67 * fVar67 + fVar66 * fVar66 + fVar64 * fVar64 + fVar65 * fVar65;
          auVar294._4_4_ =
               fVar155 * fVar155 + fVar267 * fVar267 + fVar265 * fVar265 + fVar266 * fVar266;
          auVar294._8_4_ =
               fVar161 * fVar161 + fVar160 * fVar160 + fVar156 * fVar156 + fVar157 * fVar157;
          auVar294._12_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar162 * fVar162 + fVar11 * fVar11;
          auVar84 = vrsqrt14ps_avx512vl(auVar294);
          fVar257 = auVar84._0_4_;
          fVar153 = auVar84._4_4_;
          fVar154 = auVar84._8_4_;
          fVar159 = auVar84._12_4_;
          auVar295._0_4_ = auVar294._0_4_ * -0.5 * fVar257 * fVar257 * fVar257;
          auVar295._4_4_ = auVar294._4_4_ * -0.5 * fVar153 * fVar153 * fVar153;
          auVar295._8_4_ = auVar294._8_4_ * -0.5 * fVar154 * fVar154 * fVar154;
          auVar295._12_4_ = auVar294._12_4_ * -0.5 * fVar159 * fVar159 * fVar159;
          auVar327._8_4_ = 0x3fc00000;
          auVar327._0_8_ = 0x3fc000003fc00000;
          auVar327._12_4_ = 0x3fc00000;
          auVar84 = vfmadd231ps_fma(auVar295,auVar327,auVar84);
          fVar282 = auVar84._0_4_;
          fVar299 = auVar84._4_4_;
          fVar300 = auVar84._8_4_;
          fVar301 = auVar84._12_4_;
          auVar84 = vxorps_avx512vl(auVar146,auVar242);
          bVar7 = (bool)((byte)uVar62 & 1);
          auVar151._0_4_ = (uint)bVar7 * auVar84._0_4_ | !bVar7 * auVar146._0_4_;
          bVar7 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar7 * auVar84._4_4_ | !bVar7 * auVar146._4_4_;
          bVar7 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar7 * auVar84._8_4_ | !bVar7 * auVar146._8_4_;
          bVar7 = SUB81(uVar62 >> 3,0);
          auVar151._12_4_ = (uint)bVar7 * auVar84._12_4_ | !bVar7 * auVar146._12_4_;
          bVar7 = (bool)((byte)uVar61 & 1);
          fVar257 = (float)(bVar7 * uVar63 | (uint)!bVar7 * (uVar63 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar61 >> 1) & 1);
          fVar153 = (float)(bVar7 * uVar152 | (uint)!bVar7 * (uVar152 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar61 >> 2) & 1);
          fVar154 = (float)(bVar7 * uVar57 | (uint)!bVar7 * (uVar57 ^ 0x80000000));
          bVar7 = SUB81(uVar61 >> 3,0);
          fVar159 = (float)(bVar7 * uVar158 | (uint)!bVar7 * (uVar158 ^ 0x80000000));
          auVar243._0_4_ = fVar257 * fVar282 * fVar64;
          auVar243._4_4_ = fVar153 * fVar299 * fVar265;
          auVar243._8_4_ = fVar154 * fVar300 * fVar156;
          auVar243._12_4_ = fVar159 * fVar301 * fVar162;
          auVar255._0_4_ = fVar65 * fVar282 * fVar257;
          auVar255._4_4_ = fVar266 * fVar299 * fVar153;
          auVar255._8_4_ = fVar157 * fVar300 * fVar154;
          auVar255._12_4_ = fVar11 * fVar301 * fVar159;
          auVar263._0_4_ = fVar66 * fVar282 * fVar257;
          auVar263._4_4_ = fVar267 * fVar299 * fVar153;
          auVar263._8_4_ = fVar160 * fVar300 * fVar154;
          auVar263._12_4_ = fVar12 * fVar301 * fVar159;
          auVar270._0_4_ = fVar67 * fVar282 * fVar257;
          auVar270._4_4_ = fVar155 * fVar299 * fVar153;
          auVar270._8_4_ = fVar161 * fVar300 * fVar154;
          auVar270._12_4_ = fVar13 * fVar301 * fVar159;
          auVar87 = vfmadd231ps_avx512vl(auVar243,auVar151,auVar122);
          auVar88 = vfmadd231ps_avx512vl(auVar255,auVar151,auVar119);
          auVar68 = vfmadd231ps_avx512vl(auVar263,auVar151,auVar120);
          auVar97 = vfmadd231ps_avx512vl(auVar270,auVar121,auVar151);
          auVar84 = vsubps_avx512vl(auVar147,auVar122);
          auVar69 = vfmadd213ps_avx512vl(auVar84,auVar85,auVar122);
          auVar84 = vsubps_avx512vl(auVar148,auVar119);
          auVar70 = vfmadd213ps_avx512vl(auVar84,auVar85,auVar119);
          auVar84 = vsubps_avx512vl(auVar149,auVar120);
          auVar89 = vfmadd213ps_avx512vl(auVar84,auVar85,auVar120);
          auVar84 = vsubps_avx512vl(auVar150,auVar121);
          auVar90 = vfmadd213ps_avx512vl(auVar84,auVar85,auVar121);
          auVar319._0_4_ =
               auVar90._0_4_ * auVar90._0_4_ +
               auVar89._0_4_ * auVar89._0_4_ +
               auVar69._0_4_ * auVar69._0_4_ + auVar70._0_4_ * auVar70._0_4_;
          auVar319._4_4_ =
               auVar90._4_4_ * auVar90._4_4_ +
               auVar89._4_4_ * auVar89._4_4_ +
               auVar69._4_4_ * auVar69._4_4_ + auVar70._4_4_ * auVar70._4_4_;
          auVar319._8_4_ =
               auVar90._8_4_ * auVar90._8_4_ +
               auVar89._8_4_ * auVar89._8_4_ +
               auVar69._8_4_ * auVar69._8_4_ + auVar70._8_4_ * auVar70._8_4_;
          auVar319._12_4_ =
               auVar90._12_4_ * auVar90._12_4_ +
               auVar89._12_4_ * auVar89._12_4_ +
               auVar69._12_4_ * auVar69._12_4_ + auVar70._12_4_ * auVar70._12_4_;
          auVar84 = vrsqrt14ps_avx512vl(auVar319);
          fVar64 = auVar84._0_4_;
          fVar65 = auVar84._4_4_;
          fVar66 = auVar84._8_4_;
          fVar67 = auVar84._12_4_;
          auVar277._0_4_ = auVar319._0_4_ * -0.5 * fVar64 * fVar64 * fVar64;
          auVar277._4_4_ = auVar319._4_4_ * -0.5 * fVar65 * fVar65 * fVar65;
          auVar277._8_4_ = auVar319._8_4_ * -0.5 * fVar66 * fVar66 * fVar66;
          auVar277._12_4_ = auVar319._12_4_ * -0.5 * fVar67 * fVar67 * fVar67;
          auVar84 = vfmadd231ps_fma(auVar277,auVar84,auVar327);
          auVar53._8_4_ = 0x3f7fdf3b;
          auVar53._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar53._12_4_ = 0x3f7fdf3b;
          uVar56 = vcmpps_avx512vl(auVar86,auVar53,6);
          auVar86 = vmulps_avx512vl(auVar69,auVar84);
          bVar54 = (byte)uVar56;
          fVar64 = (float)((uint)(bVar54 & 1) * auVar86._0_4_ |
                          (uint)!(bool)(bVar54 & 1) * auVar87._0_4_);
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar257 = (float)((uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * auVar87._4_4_);
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar155 = (float)((uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * auVar87._8_4_);
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar160 = (float)((uint)bVar7 * auVar86._12_4_ | (uint)!bVar7 * auVar87._12_4_);
          auVar86 = vmulps_avx512vl(auVar70,auVar84);
          fVar65 = (float)((uint)(bVar54 & 1) * auVar86._0_4_ |
                          (uint)!(bool)(bVar54 & 1) * auVar88._0_4_);
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar265 = (float)((uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * auVar88._4_4_);
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar153 = (float)((uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * auVar88._8_4_);
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar161 = (float)((uint)bVar7 * auVar86._12_4_ | (uint)!bVar7 * auVar88._12_4_);
          auVar86 = vmulps_avx512vl(auVar89,auVar84);
          fVar66 = (float)((uint)(bVar54 & 1) * auVar86._0_4_ |
                          (uint)!(bool)(bVar54 & 1) * auVar68._0_4_);
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar266 = (float)((uint)bVar7 * auVar86._4_4_ | (uint)!bVar7 * auVar68._4_4_);
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar156 = (float)((uint)bVar7 * auVar86._8_4_ | (uint)!bVar7 * auVar68._8_4_);
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar154 = (float)((uint)bVar7 * auVar86._12_4_ | (uint)!bVar7 * auVar68._12_4_);
          auVar84 = vmulps_avx512vl(auVar90,auVar84);
          fVar67 = (float)((uint)(bVar54 & 1) * auVar84._0_4_ |
                          (uint)!(bool)(bVar54 & 1) * auVar97._0_4_);
          bVar7 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar267 = (float)((uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * auVar97._4_4_);
          bVar7 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar157 = (float)((uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * auVar97._8_4_);
          bVar7 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar162 = (float)((uint)bVar7 * auVar84._12_4_ | (uint)!bVar7 * auVar97._12_4_);
          auVar84 = vsubps_avx(auVar209,auVar85);
          auVar86 = vmulps_avx512vl(auVar85,auVar124);
          auVar69 = vfmadd213ps_avx512vl(auVar116,auVar84,auVar86);
          auVar86 = vmulps_avx512vl(auVar85,auVar125);
          auVar70 = vfmadd213ps_avx512vl(auVar118,auVar84,auVar86);
          auVar86 = vmulps_avx512vl(auVar85,auVar126);
          auVar89 = vfmadd213ps_avx512vl(local_108,auVar84,auVar86);
          auVar86 = vmulps_avx512vl(auVar85,auVar140);
          auVar85 = vmulps_avx512vl(auVar85,auVar141);
          auVar278._0_4_ = fVar163 * local_78;
          auVar278._4_4_ = fVar174 * fStack_74;
          auVar278._8_4_ = fVar175 * fStack_70;
          auVar278._12_4_ = fVar176 * fStack_6c;
          auVar90 = vfmadd213ps_avx512vl(local_118,auVar84,auVar86);
          auVar91 = vfmadd213ps_avx512vl(local_158,auVar84,auVar85);
          auVar92 = vfmadd213ps_avx512vl(local_f8,auVar84,auVar278);
          auVar210._0_4_ = fVar163 * local_68;
          auVar210._4_4_ = fVar174 * fStack_64;
          auVar210._8_4_ = fVar175 * fStack_60;
          auVar210._12_4_ = fVar176 * fStack_5c;
          auVar226._0_4_ = fVar163 * local_58;
          auVar226._4_4_ = fVar174 * fStack_54;
          auVar226._8_4_ = fVar175 * fStack_50;
          auVar226._12_4_ = fVar176 * fStack_4c;
          auVar279._0_4_ = fVar163 * local_48;
          auVar279._4_4_ = fVar174 * fStack_44;
          auVar279._8_4_ = fVar175 * fStack_40;
          auVar279._12_4_ = fVar176 * fStack_3c;
          auVar93 = vfmadd213ps_avx512vl(local_138,auVar84,auVar210);
          auVar94 = vfmadd213ps_avx512vl(local_d8,auVar84,auVar226);
          auVar95 = vfmadd213ps_avx512vl(local_e8,auVar84,auVar279);
          auVar211._0_4_ = fVar163 * local_38;
          auVar211._4_4_ = fVar174 * fStack_34;
          auVar211._8_4_ = fVar175 * fStack_30;
          auVar211._12_4_ = fVar176 * fStack_2c;
          auVar227._0_4_ = fVar163 * local_b8;
          auVar227._4_4_ = fVar174 * fStack_b4;
          auVar227._8_4_ = fVar175 * fStack_b0;
          auVar227._12_4_ = fVar176 * fStack_ac;
          auVar171._0_4_ = fVar163 * local_c8;
          auVar171._4_4_ = fVar174 * fStack_c4;
          auVar171._8_4_ = fVar175 * fStack_c0;
          auVar171._12_4_ = fVar176 * fStack_bc;
          auVar96 = vfmadd213ps_avx512vl(local_168,auVar84,auVar211);
          auVar117 = vfmadd213ps_avx512vl(local_148,auVar84,auVar227);
          auVar113 = vfmadd213ps_avx512vl(local_128,auVar84,auVar171);
          auVar212._0_4_ = fVar64 * fVar64;
          auVar212._4_4_ = fVar257 * fVar257;
          auVar212._8_4_ = fVar155 * fVar155;
          auVar212._12_4_ = fVar160 * fVar160;
          auVar228._0_4_ = fVar65 * fVar65;
          auVar228._4_4_ = fVar265 * fVar265;
          auVar228._8_4_ = fVar153 * fVar153;
          auVar228._12_4_ = fVar161 * fVar161;
          auVar172._0_4_ = auVar212._0_4_ + auVar228._0_4_;
          auVar172._4_4_ = auVar212._4_4_ + auVar228._4_4_;
          auVar172._8_4_ = auVar212._8_4_ + auVar228._8_4_;
          auVar172._12_4_ = auVar212._12_4_ + auVar228._12_4_;
          auVar307._0_4_ = fVar66 * fVar66;
          auVar307._4_4_ = fVar266 * fVar266;
          auVar307._8_4_ = fVar156 * fVar156;
          auVar307._12_4_ = fVar154 * fVar154;
          auVar84 = vsubps_avx(auVar172,auVar307);
          auVar316._0_4_ = fVar67 * fVar67;
          auVar316._4_4_ = fVar267 * fVar267;
          auVar316._8_4_ = fVar157 * fVar157;
          auVar316._12_4_ = fVar162 * fVar162;
          auVar84 = vsubps_avx(auVar84,auVar316);
          auVar280._0_4_ = fVar65 * fVar66;
          auVar280._4_4_ = fVar265 * fVar266;
          auVar280._8_4_ = fVar153 * fVar156;
          auVar280._12_4_ = fVar161 * fVar154;
          auVar296._0_4_ = fVar67 * fVar64;
          auVar296._4_4_ = fVar267 * fVar257;
          auVar296._8_4_ = fVar157 * fVar155;
          auVar296._12_4_ = fVar162 * fVar160;
          auVar173._0_4_ = auVar280._0_4_ + auVar296._0_4_ + auVar280._0_4_ + auVar296._0_4_;
          auVar173._4_4_ = auVar280._4_4_ + auVar296._4_4_ + auVar280._4_4_ + auVar296._4_4_;
          auVar173._8_4_ = auVar280._8_4_ + auVar296._8_4_ + auVar280._8_4_ + auVar296._8_4_;
          auVar173._12_4_ = auVar280._12_4_ + auVar296._12_4_ + auVar280._12_4_ + auVar296._12_4_;
          auVar320._0_4_ = fVar67 * fVar65;
          auVar320._4_4_ = fVar267 * fVar265;
          auVar320._8_4_ = fVar157 * fVar153;
          auVar320._12_4_ = fVar162 * fVar161;
          auVar322._0_4_ = fVar64 * fVar66;
          auVar322._4_4_ = fVar257 * fVar266;
          auVar322._8_4_ = fVar155 * fVar156;
          auVar322._12_4_ = fVar160 * fVar154;
          auVar85 = vsubps_avx(auVar320,auVar322);
          auVar328._0_4_ = auVar85._0_4_ + auVar85._0_4_;
          auVar328._4_4_ = auVar85._4_4_ + auVar85._4_4_;
          auVar328._8_4_ = auVar85._8_4_ + auVar85._8_4_;
          auVar328._12_4_ = auVar85._12_4_ + auVar85._12_4_;
          auVar85 = vsubps_avx(auVar280,auVar296);
          auVar97 = vaddps_avx512vl(auVar85,auVar85);
          auVar85 = vsubps_avx(auVar212,auVar228);
          auVar229._0_4_ = auVar307._0_4_ + auVar85._0_4_;
          auVar229._4_4_ = auVar307._4_4_ + auVar85._4_4_;
          auVar229._8_4_ = auVar307._8_4_ + auVar85._8_4_;
          auVar229._12_4_ = auVar307._12_4_ + auVar85._12_4_;
          auVar86 = vsubps_avx(auVar229,auVar316);
          auVar230._0_4_ = fVar67 * fVar66;
          auVar230._4_4_ = fVar267 * fVar266;
          auVar230._8_4_ = fVar157 * fVar156;
          auVar230._12_4_ = fVar162 * fVar154;
          auVar244._0_4_ = fVar64 * fVar65;
          auVar244._4_4_ = fVar257 * fVar265;
          auVar244._8_4_ = fVar155 * fVar153;
          auVar244._12_4_ = fVar160 * fVar161;
          auVar256._0_4_ = auVar230._0_4_ + auVar244._0_4_ + auVar230._0_4_ + auVar244._0_4_;
          auVar256._4_4_ = auVar230._4_4_ + auVar244._4_4_ + auVar230._4_4_ + auVar244._4_4_;
          auVar256._8_4_ = auVar230._8_4_ + auVar244._8_4_ + auVar230._8_4_ + auVar244._8_4_;
          auVar256._12_4_ = auVar230._12_4_ + auVar244._12_4_ + auVar230._12_4_ + auVar244._12_4_;
          auVar264._0_4_ = auVar320._0_4_ + auVar322._0_4_ + auVar320._0_4_ + auVar322._0_4_;
          auVar264._4_4_ = auVar320._4_4_ + auVar322._4_4_ + auVar320._4_4_ + auVar322._4_4_;
          auVar264._8_4_ = auVar320._8_4_ + auVar322._8_4_ + auVar320._8_4_ + auVar322._8_4_;
          auVar264._12_4_ = auVar320._12_4_ + auVar322._12_4_ + auVar320._12_4_ + auVar322._12_4_;
          auVar87 = vsubps_avx(auVar230,auVar244);
          auVar297._0_4_ = auVar87._0_4_ + auVar87._0_4_;
          auVar297._4_4_ = auVar87._4_4_ + auVar87._4_4_;
          auVar297._8_4_ = auVar87._8_4_ + auVar87._8_4_;
          auVar297._12_4_ = auVar87._12_4_ + auVar87._12_4_;
          auVar85 = vsubps_avx(auVar85,auVar307);
          auVar213._0_4_ = auVar316._0_4_ + auVar85._0_4_;
          auVar213._4_4_ = auVar316._4_4_ + auVar85._4_4_;
          auVar213._8_4_ = auVar316._8_4_ + auVar85._8_4_;
          auVar213._12_4_ = auVar316._12_4_ + auVar85._12_4_;
          auVar231._0_4_ = auVar328._0_4_ * 0.0;
          auVar231._4_4_ = auVar328._4_4_ * 0.0;
          auVar231._8_4_ = auVar328._8_4_ * 0.0;
          auVar231._12_4_ = auVar328._12_4_ * 0.0;
          auVar85 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar173,auVar231);
          auVar232._0_4_ = auVar173._0_4_ + auVar231._0_4_;
          auVar232._4_4_ = auVar173._4_4_ + auVar231._4_4_;
          auVar232._8_4_ = auVar173._8_4_ + auVar231._8_4_;
          auVar232._12_4_ = auVar173._12_4_ + auVar231._12_4_;
          auVar87 = vfmadd213ps_fma(auVar173,auVar185,auVar328);
          auVar88 = vfmadd231ps_fma(auVar232,auVar84,auVar185);
          auVar68 = vfmadd231ps_fma(auVar87,auVar185,auVar84);
          auVar245._0_4_ = auVar256._0_4_ * 0.0;
          auVar245._4_4_ = auVar256._4_4_ * 0.0;
          auVar245._8_4_ = auVar256._8_4_ * 0.0;
          auVar245._12_4_ = auVar256._12_4_ * 0.0;
          auVar87 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar86,auVar245);
          auVar308._0_4_ = auVar86._0_4_ + auVar245._0_4_;
          auVar308._4_4_ = auVar86._4_4_ + auVar245._4_4_;
          auVar308._8_4_ = auVar86._8_4_ + auVar245._8_4_;
          auVar308._12_4_ = auVar86._12_4_ + auVar245._12_4_;
          auVar86 = vfmadd213ps_fma(auVar86,auVar185,auVar256);
          auVar114 = vaddps_avx512vl(auVar97,auVar87);
          auVar115 = vfmadd231ps_avx512vl(auVar308,auVar97,auVar185);
          auVar116 = vfmadd231ps_avx512vl(auVar86,auVar185,auVar97);
          auVar246._0_4_ = auVar213._0_4_ * 0.0;
          auVar246._4_4_ = auVar213._4_4_ * 0.0;
          auVar246._8_4_ = auVar213._8_4_ * 0.0;
          auVar246._12_4_ = auVar213._12_4_ * 0.0;
          auVar86 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar297,auVar246);
          auVar97 = vaddps_avx512vl(auVar297,auVar246);
          auVar87 = vfmadd213ps_fma(auVar297,auVar185,auVar213);
          auVar118 = vaddps_avx512vl(auVar264,auVar86);
          auVar119 = vfmadd231ps_avx512vl(auVar97,auVar264,auVar185);
          auVar97 = vfmadd231ps_fma(auVar87,auVar185,auVar264);
          auVar70 = vaddps_avx512vl(auVar70,auVar185);
          auVar89 = vaddps_avx512vl(auVar89,auVar185);
          auVar92 = vaddps_avx512vl(auVar92,auVar185);
          auVar120 = vmulps_avx512vl(auVar118,auVar185);
          auVar121 = vmulps_avx512vl(auVar119,auVar185);
          auVar122 = vmulps_avx512vl(auVar97,auVar185);
          auVar86 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar114,auVar120);
          auVar87 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar115,auVar121);
          auVar124 = vfmadd213ps_avx512vl(auVar185,auVar116,auVar122);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar91,auVar114);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar91,auVar115);
          auVar91 = vfmadd213ps_avx512vl(auVar91,auVar116,auVar122);
          auVar122 = vmulps_avx512vl(auVar95,auVar118);
          auVar125 = vmulps_avx512vl(auVar95,auVar119);
          auVar95 = vmulps_avx512vl(auVar95,auVar97);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar94,auVar114);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar94,auVar115);
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar116,auVar94);
          auVar95 = vmulps_avx512vl(auVar113,auVar118);
          auVar118 = vmulps_avx512vl(auVar113,auVar119);
          auVar97 = vmulps_avx512vl(auVar113,auVar97);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar117,auVar114);
          auVar113 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar115);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar117,auVar116);
          auVar194._0_4_ = auVar85._0_4_ + auVar84._0_4_;
          auVar194._4_4_ = auVar85._4_4_ + auVar84._4_4_;
          auVar194._8_4_ = auVar85._8_4_ + auVar84._8_4_;
          auVar194._12_4_ = auVar85._12_4_ + auVar84._12_4_;
          auVar84 = vfmadd231ps_avx512vl(auVar86,auVar69,auVar194);
          auVar85 = vfmadd231ps_avx512vl(auVar87,auVar69,auVar88);
          auVar86 = vfmadd231ps_avx512vl(auVar124,auVar68,auVar69);
          auVar87 = vfmadd231ps_avx512vl(auVar120,auVar90,auVar194);
          auVar69 = vfmadd231ps_avx512vl(auVar121,auVar90,auVar88);
          auVar90 = vfmadd231ps_avx512vl(auVar91,auVar68,auVar90);
          auVar91 = vfmadd231ps_avx512vl(auVar122,auVar93,auVar194);
          auVar117 = vfmadd231ps_avx512vl(auVar125,auVar93,auVar88);
          auVar93 = vfmadd231ps_avx512vl(auVar94,auVar68,auVar93);
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar194);
          auVar94 = vaddps_avx512vl(auVar70,auVar94);
          auVar88 = vfmadd231ps_avx512vl(auVar113,auVar96,auVar88);
          auVar95 = vaddps_avx512vl(auVar89,auVar88);
          auVar88 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar68);
          fVar163 = auVar92._0_4_ + auVar88._0_4_;
          fVar174 = auVar92._4_4_ + auVar88._4_4_;
          fVar175 = auVar92._8_4_ + auVar88._8_4_;
          fVar176 = auVar92._12_4_ + auVar88._12_4_;
          auVar88 = vmulps_avx512vl(auVar117,auVar90);
          auVar88 = vfmsub231ps_avx512vl(auVar88,auVar69,auVar93);
          auVar68 = vmulps_avx512vl(auVar93,auVar87);
          auVar97 = vfmsub231ps_avx512vl(auVar68,auVar90,auVar91);
          auVar68 = vmulps_avx512vl(auVar91,auVar69);
          auVar70 = vfmsub231ps_avx512vl(auVar68,auVar87,auVar117);
          auVar68 = vmulps_avx512vl(auVar86,auVar91);
          auVar89 = vfmsub231ps_avx512vl(auVar68,auVar84,auVar93);
          auVar68 = vmulps_avx512vl(auVar85,auVar93);
          auVar92 = vfmsub231ps_avx512vl(auVar68,auVar117,auVar86);
          auVar68 = vmulps_avx512vl(auVar84,auVar117);
          auVar91 = vfmsub231ps_avx512vl(auVar68,auVar85,auVar91);
          auVar323._0_4_ = auVar69._0_4_ * auVar86._0_4_;
          auVar323._4_4_ = auVar69._4_4_ * auVar86._4_4_;
          auVar323._8_4_ = auVar69._8_4_ * auVar86._8_4_;
          auVar323._12_4_ = auVar69._12_4_ * auVar86._12_4_;
          auVar93 = vfmsub231ps_avx512vl(auVar323,auVar85,auVar90);
          auVar68 = vmulps_avx512vl(auVar90,auVar84);
          auVar68 = vfmsub231ps_fma(auVar68,auVar86,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar85);
          auVar90 = vfmsub231ps_avx512vl(auVar87,auVar84,auVar69);
          auVar86 = vmulps_avx512vl(auVar86,auVar70);
          auVar85 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar85);
          auVar96 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar84);
          auVar84 = vdivps_avx512vl(auVar88,auVar96);
          auVar85 = vdivps_avx512vl(auVar92,auVar96);
          auVar86 = vdivps_avx512vl(auVar93,auVar96);
          auVar87 = vdivps_avx512vl(auVar97,auVar96);
          auVar88 = vdivps_avx512vl(auVar89,auVar96);
          auVar68 = vdivps_avx512vl(auVar68,auVar96);
          auVar97 = vdivps_avx512vl(auVar70,auVar96);
          auVar69 = vdivps_avx512vl(auVar91,auVar96);
          auVar70 = vdivps_avx512vl(auVar90,auVar96);
          auVar281._0_4_ = fVar163 * auVar97._0_4_;
          auVar281._4_4_ = fVar174 * auVar97._4_4_;
          auVar281._8_4_ = fVar175 * auVar97._8_4_;
          auVar281._12_4_ = fVar176 * auVar97._12_4_;
          auVar298._0_4_ = fVar163 * auVar69._0_4_;
          auVar298._4_4_ = fVar174 * auVar69._4_4_;
          auVar298._8_4_ = fVar175 * auVar69._8_4_;
          auVar298._12_4_ = fVar176 * auVar69._12_4_;
          auVar317._0_4_ = fVar163 * auVar70._0_4_;
          auVar317._4_4_ = fVar174 * auVar70._4_4_;
          auVar317._8_4_ = fVar175 * auVar70._8_4_;
          auVar317._12_4_ = fVar176 * auVar70._12_4_;
          auVar89 = vfmadd231ps_fma(auVar281,auVar95,auVar87);
          auVar90 = vfmadd231ps_fma(auVar298,auVar95,auVar88);
          auVar91 = vfmadd231ps_fma(auVar317,auVar68,auVar95);
          auVar89 = vfmadd231ps_fma(auVar89,auVar94,auVar84);
          auVar90 = vfmadd231ps_fma(auVar90,auVar94,auVar85);
          auVar91 = vfmadd231ps_fma(auVar91,auVar86,auVar94);
        }
      }
      else {
        fVar163 = (pGVar4->time_range).lower;
        auVar164._4_4_ = fVar163;
        auVar164._0_4_ = fVar163;
        auVar164._8_4_ = fVar163;
        auVar164._12_4_ = fVar163;
        fVar174 = pGVar4->fnumTimeSegments;
        auVar88 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar164);
        fVar163 = (pGVar4->time_range).upper - fVar163;
        auVar165._4_4_ = fVar163;
        auVar165._0_4_ = fVar163;
        auVar165._8_4_ = fVar163;
        auVar165._12_4_ = fVar163;
        auVar68 = vdivps_avx(auVar88,auVar165);
        auVar166._0_4_ = fVar174 * auVar68._0_4_;
        auVar166._4_4_ = fVar174 * auVar68._4_4_;
        auVar166._8_4_ = fVar174 * auVar68._8_4_;
        auVar166._12_4_ = fVar174 * auVar68._12_4_;
        auVar68 = vroundps_avx(auVar166,1);
        fVar174 = fVar174 + -1.0;
        auVar71._4_4_ = fVar174;
        auVar71._0_4_ = fVar174;
        auVar71._8_4_ = fVar174;
        auVar71._12_4_ = fVar174;
        auVar97 = vminps_avx(auVar68,auVar71);
        auVar68 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
        auVar69 = vmaxps_avx512vl(auVar97,auVar68);
        auVar97 = vsubps_avx(auVar166,auVar69);
        auVar69 = vcvtps2dq_avx512vl(auVar69);
        local_a8 = vmovdqa64_avx512vl(auVar69);
        uVar63 = 0;
        for (uVar152 = (uint)bVar54; (uVar152 & 1) == 0; uVar152 = uVar152 >> 1 | 0x80000000) {
          uVar63 = uVar63 + 1;
        }
        auVar70 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpeqd_avx512vl(auVar69,auVar70);
        if ((byte)(bVar54 ^ 0xf | (byte)uVar14 & 0xf) == 0xf) {
          plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                           (long)*(int *)(local_a8 + (ulong)uVar63 * 4) * 0x38);
          iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                          (long)*(int *)(local_a8 + (ulong)uVar63 * 4) * 0x38);
          if (iVar3 == 0x9134) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
            auVar70 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
            auVar71 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
            auVar88 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
            auVar84 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
            auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
          }
          else if (iVar3 == 0x9234) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar195._8_8_ = 0;
            auVar195._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
            auVar233._8_8_ = 0;
            auVar233._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar70 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,auVar195);
            auVar71 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                         auVar233);
            auVar234._8_8_ = 0;
            auVar234._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            auVar88 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                         auVar234);
            auVar235._8_8_ = 0;
            auVar235._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
            auVar84 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                         auVar235);
          }
          else if (iVar3 == 0xb001) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar178._8_8_ = 0;
            auVar178._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar88 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
            auVar179._8_8_ = 0;
            auVar179._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
            auVar69 = vpermt2ps_avx512vl(auVar179,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58)));
            auVar247._8_8_ = 0;
            auVar247._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            fVar163 = *(float *)(lVar6 + 0x24 + lVar58);
            fVar174 = *(float *)(lVar6 + 0x28 + lVar58);
            fVar175 = *(float *)(lVar6 + 0x2c + lVar58);
            auVar70 = vpermt2ps_avx512vl(auVar247,_DAT_01fefe90,
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
            fVar176 = *(float *)(lVar6 + 0x30 + lVar58);
            auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),ZEXT416((uint)fVar163),
                                      ZEXT416((uint)fVar163));
            auVar84 = vfmadd231ss_fma(auVar84,ZEXT416((uint)fVar175),ZEXT416((uint)fVar175));
            auVar84 = vfmadd231ss_fma(auVar84,ZEXT416((uint)fVar176),ZEXT416((uint)fVar176));
            auVar89 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar84._0_4_));
            fVar64 = auVar89._0_4_;
            fVar64 = fVar64 * 1.5 + fVar64 * fVar64 * fVar64 * auVar84._0_4_ * -0.5;
            auVar84 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar163 * fVar64)),0x30);
            auVar70 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar174 * fVar64)),0x30);
            auVar88 = vinsertps_avx(auVar88,ZEXT416((uint)(fVar176 * fVar64)),0x30);
            auVar69 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
            auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
            auVar71 = vinsertps_avx(auVar69,ZEXT416((uint)(fVar175 * fVar64)),0x30);
          }
          else if (iVar3 == 0x9244) {
            lVar6 = *plVar1;
            lVar58 = plVar1[2] * uVar56;
            auVar70 = *(undefined1 (*) [16])(lVar6 + lVar58);
            auVar71 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar58);
            auVar88 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar58);
            auVar84 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar58);
          }
          iVar3 = (int)plVar1[0xb];
          if (iVar3 == 0x9134) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar85 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
            auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
            auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
            auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
            auVar87 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
            auVar87 = vinsertps_avx512f(auVar87,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
            auVar68 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
            auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
          }
          else if (iVar3 == 0x9234) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar215._8_8_ = 0;
            auVar215._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
            auVar248._8_8_ = 0;
            auVar248._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar85 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,auVar215);
            auVar86 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                         auVar248);
            auVar216._8_8_ = 0;
            auVar216._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            auVar87 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                         auVar216);
            auVar217._8_8_ = 0;
            auVar217._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
            auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                         auVar217);
          }
          else if (iVar3 == 0xb001) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar218._8_8_ = 0;
            auVar218._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
            auVar86 = vinsertps_avx(auVar218,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
            auVar236._8_8_ = 0;
            auVar236._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
            auVar87 = vpermt2ps_avx512vl(auVar236,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58)));
            auVar271._8_8_ = 0;
            auVar271._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
            fVar163 = *(float *)(lVar6 + 0x24 + lVar58);
            fVar174 = *(float *)(lVar6 + 0x28 + lVar58);
            fVar175 = *(float *)(lVar6 + 0x2c + lVar58);
            auVar68 = vpermt2ps_avx512vl(auVar271,_DAT_01fefe90,
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
            fVar176 = *(float *)(lVar6 + 0x30 + lVar58);
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),ZEXT416((uint)fVar163),
                                      ZEXT416((uint)fVar163));
            auVar85 = vfmadd231ss_fma(auVar85,ZEXT416((uint)fVar175),ZEXT416((uint)fVar175));
            auVar85 = vfmadd231ss_fma(auVar85,ZEXT416((uint)fVar176),ZEXT416((uint)fVar176));
            auVar324._4_12_ = ZEXT812(0) << 0x20;
            auVar324._0_4_ = auVar85._0_4_;
            auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar324);
            fVar64 = auVar69._0_4_;
            fVar64 = fVar64 * 1.5 + fVar64 * fVar64 * fVar64 * auVar85._0_4_ * -0.5;
            auVar68 = vinsertps_avx512f(auVar68,ZEXT416((uint)(fVar163 * fVar64)),0x30);
            auVar85 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar174 * fVar64)),0x30);
            auVar87 = vinsertps_avx512f(auVar86,ZEXT416((uint)(fVar176 * fVar64)),0x30);
            auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                    ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
            auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
            auVar86 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar175 * fVar64)),0x30);
          }
          else if (iVar3 == 0x9244) {
            lVar6 = plVar1[7];
            lVar58 = uVar56 * plVar1[9];
            auVar85 = *(undefined1 (*) [16])(lVar6 + lVar58);
            auVar86 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar58);
            auVar87 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar58);
            auVar68 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar58);
          }
          uVar177 = auVar70._0_4_;
          auVar100._4_4_ = uVar177;
          auVar100._0_4_ = uVar177;
          auVar100._8_4_ = uVar177;
          auVar100._12_4_ = uVar177;
          auVar101 = vshufps_avx(auVar70,auVar70,0x55);
          auVar102 = vshufps_avx(auVar70,auVar70,0xaa);
          uVar177 = auVar71._0_4_;
          auVar103._4_4_ = uVar177;
          auVar103._0_4_ = uVar177;
          auVar103._8_4_ = uVar177;
          auVar103._12_4_ = uVar177;
          auVar104 = vshufps_avx(auVar71,auVar71,0x55);
          auVar105 = vshufps_avx(auVar71,auVar71,0xaa);
          uVar177 = auVar88._0_4_;
          auVar106._4_4_ = uVar177;
          auVar106._0_4_ = uVar177;
          auVar106._8_4_ = uVar177;
          auVar106._12_4_ = uVar177;
          auVar107 = vshufps_avx(auVar88,auVar88,0x55);
          auVar108 = vshufps_avx(auVar88,auVar88,0xaa);
          uVar177 = auVar84._0_4_;
          auVar109._4_4_ = uVar177;
          auVar109._0_4_ = uVar177;
          auVar109._8_4_ = uVar177;
          auVar109._12_4_ = uVar177;
          auVar110 = vshufps_avx(auVar84,auVar84,0x55);
          auVar111 = vshufps_avx(auVar84,auVar84,0xaa);
          auVar72 = vbroadcastss_avx512vl(auVar85);
          auVar73 = vshufps_avx512vl(auVar85,auVar85,0x55);
          auVar74 = vshufps_avx512vl(auVar85,auVar85,0xaa);
          auVar75 = vbroadcastss_avx512vl(auVar86);
          auVar76 = vshufps_avx512vl(auVar86,auVar86,0x55);
          auVar77 = vshufps_avx512vl(auVar86,auVar86,0xaa);
          auVar78 = vbroadcastss_avx512vl(auVar87);
          auVar79 = vshufps_avx512vl(auVar87,auVar87,0x55);
          auVar80 = vshufps_avx512vl(auVar87,auVar87,0xaa);
          auVar81 = vbroadcastss_avx512vl(auVar68);
          auVar82 = vshufps_avx512vl(auVar68,auVar68,0x55);
          auVar83 = vshufps_avx512vl(auVar68,auVar68,0xaa);
        }
        else {
          uVar63 = uVar55;
          do {
            uVar152 = 0;
            for (uVar57 = uVar63 & 0xff; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
              uVar152 = uVar152 + 1;
            }
            plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                             (long)*(int *)(local_a8 + (ulong)uVar152 * 4) * 0x38);
            iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_a8 + (ulong)uVar152 * 4) * 0x38);
            auVar98._4_12_ = auVar68._4_12_;
            if (iVar3 == 0x9134) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
              local_158 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
              local_138 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
              local_148 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
              local_128 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              auVar331._8_8_ = 0;
              auVar331._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
              local_158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,
                                             auVar331);
              auVar338._8_8_ = 0;
              auVar338._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              local_138 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                             auVar338);
              auVar332._8_8_ = 0;
              auVar332._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              local_148 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80
                                             ,auVar332);
              auVar333._8_8_ = 0;
              auVar333._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
              local_128 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80
                                             ,auVar333);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              auVar339._8_8_ = 0;
              auVar339._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              auVar84 = vinsertps_avx512f(auVar339,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
              auVar340._8_8_ = 0;
              auVar340._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
              auVar85 = vpermt2ps_avx512vl(auVar340,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58))
                                          );
              auVar343._8_8_ = 0;
              auVar343._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar86 = vpermt2ps_avx512vl(auVar343,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
              uVar152 = *(uint *)(lVar6 + 0x24 + lVar58);
              uVar57 = *(uint *)(lVar6 + 0x28 + lVar58);
              uVar158 = *(uint *)(lVar6 + 0x2c + lVar58);
              uVar2 = *(uint *)(lVar6 + 0x30 + lVar58);
              auVar87 = vmulss_avx512f(ZEXT416(uVar57),ZEXT416(uVar57));
              auVar87 = vfmadd231ss_avx512f(auVar87,ZEXT416(uVar152),ZEXT416(uVar152));
              auVar87 = vfmadd231ss_avx512f(auVar87,ZEXT416(uVar158),ZEXT416(uVar158));
              auVar87 = vfmadd231ss_avx512f(auVar87,ZEXT416(uVar2),ZEXT416(uVar2));
              auVar98._0_4_ = auVar87._0_4_;
              auVar89 = vrsqrt14ss_avx512f(auVar68,auVar98);
              auVar90 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar87 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              auVar87 = vmulss_avx512f(auVar89,auVar87);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar87 = vmulss_avx512f(auVar89,auVar87);
              auVar87 = vaddss_avx512f(auVar90,auVar87);
              auVar89 = vmulss_avx512f(ZEXT416(uVar152),auVar87);
              local_128 = vinsertps_avx512f(auVar86,auVar89,0x30);
              auVar86 = vmulss_avx512f(auVar87,ZEXT416(uVar57));
              local_158 = vinsertps_avx512f(auVar85,auVar86,0x30);
              auVar85 = vmulss_avx512f(auVar87,ZEXT416(uVar158));
              auVar86 = vmulss_avx512f(auVar87,ZEXT416(uVar2));
              local_148 = vinsertps_avx512f(auVar84,auVar86,0x30);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
              auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
              local_138 = vinsertps_avx512f(auVar84,auVar85,0x30);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = *plVar1;
              lVar58 = plVar1[2] * uVar56;
              local_158 = *(undefined1 (*) [16])(lVar6 + lVar58);
              local_138 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar58);
              local_148 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar58);
              local_128 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar58);
            }
            auVar84 = vpbroadcastd_avx512vl();
            uVar14 = vpcmpeqd_avx512vl(auVar84,auVar69);
            iVar3 = (int)plVar1[0xb];
            if (iVar3 == 0x9134) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x10 + lVar58)),0x1c);
              local_168 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar58)),0x28);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x14 + lVar58)),0x1c);
              auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),0x28);
              in_ZMM28 = ZEXT1664(auVar84);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),0x1c);
              auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar58)),0x28);
              in_ZMM30 = ZEXT1664(auVar84);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 0x1c + lVar58)),0x1c);
              auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar58)),0x28);
              in_ZMM29 = ZEXT1664(auVar84);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              local_168._8_8_ = 0;
              local_168._0_8_ = *(ulong *)(lVar6 + 4 + lVar58);
              local_168 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar58)),_DAT_01fefe80,
                                             local_168);
              auVar334._8_8_ = 0;
              auVar334._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              auVar84 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),_DAT_01fefe80,
                                           auVar334);
              in_ZMM28 = ZEXT1664(auVar84);
              auVar335._8_8_ = 0;
              auVar335._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar84 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)),_DAT_01fefe80,
                                           auVar335);
              in_ZMM30 = ZEXT1664(auVar84);
              auVar336._8_8_ = 0;
              auVar336._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar58);
              auVar84 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar58)),_DAT_01fefe80,
                                           auVar336);
              in_ZMM29 = ZEXT1664(auVar84);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = plVar1[7];
              lVar58 = plVar1[9] * uVar56;
              auVar337._8_8_ = 0;
              auVar337._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar58);
              auVar84 = vinsertps_avx512f(auVar337,ZEXT416(*(uint *)(lVar6 + 8 + lVar58)),0x20);
              auVar341._8_8_ = 0;
              auVar341._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar58);
              auVar86 = vpermt2ps_avx512vl(auVar341,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar58))
                                          );
              auVar342._8_8_ = 0;
              auVar342._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar58);
              auVar85 = vpermt2ps_avx512vl(auVar342,_DAT_01fefe90,
                                           ZEXT416(*(uint *)(lVar6 + 0x18 + lVar58)));
              uVar152 = *(uint *)(lVar6 + 0x24 + lVar58);
              uVar57 = *(uint *)(lVar6 + 0x28 + lVar58);
              uVar158 = *(uint *)(lVar6 + 0x2c + lVar58);
              uVar2 = *(uint *)(lVar6 + 0x30 + lVar58);
              auVar87 = vmulss_avx512f(ZEXT416(uVar57),ZEXT416(uVar57));
              auVar87 = vfmadd231ss_avx512f(auVar87,ZEXT416(uVar152),ZEXT416(uVar152));
              auVar87 = vfmadd231ss_avx512f(auVar87,ZEXT416(uVar158),ZEXT416(uVar158));
              auVar87 = vfmadd231ss_avx512f(auVar87,ZEXT416(uVar2),ZEXT416(uVar2));
              auVar99._4_12_ = auVar98._4_12_;
              auVar99._0_4_ = auVar87._0_4_;
              auVar89 = vrsqrt14ss_avx512f(auVar68,auVar99);
              auVar90 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar87 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              auVar87 = vmulss_avx512f(auVar89,auVar87);
              auVar89 = vmulss_avx512f(auVar89,auVar89);
              auVar87 = vmulss_avx512f(auVar89,auVar87);
              auVar87 = vaddss_avx512f(auVar90,auVar87);
              auVar89 = vmulss_avx512f(ZEXT416(uVar152),auVar87);
              auVar85 = vinsertps_avx512f(auVar85,auVar89,0x30);
              auVar89 = vmulss_avx512f(auVar87,ZEXT416(uVar57));
              local_168 = vinsertps_avx512f(auVar86,auVar89,0x30);
              in_ZMM29 = ZEXT1664(auVar85);
              auVar85 = vmulss_avx512f(auVar87,ZEXT416(uVar158));
              auVar86 = vmulss_avx512f(auVar87,ZEXT416(uVar2));
              auVar84 = vinsertps_avx512f(auVar84,auVar86,0x30);
              in_ZMM30 = ZEXT1664(auVar84);
              auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar58)),
                                          ZEXT416(*(uint *)(lVar6 + 4 + lVar58)),0x10);
              auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar58)),0x20);
              auVar84 = vinsertps_avx512f(auVar84,auVar85,0x30);
              in_ZMM28 = ZEXT1664(auVar84);
            }
            else {
              in_ZMM28 = ZEXT1664(in_ZMM28._0_16_);
              in_ZMM30 = ZEXT1664(in_ZMM30._0_16_);
              in_ZMM29 = ZEXT1664(in_ZMM29._0_16_);
              if (iVar3 == 0x9244) {
                lVar6 = plVar1[7];
                lVar58 = plVar1[9] * uVar56;
                auVar84 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar6 + lVar58));
                local_168 = vmovdqa64_avx512vl(auVar84);
                in_ZMM28 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar58));
                in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar58));
                in_ZMM29 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar58));
              }
            }
            bVar60 = (byte)uVar63 & (byte)uVar14 & 0xf;
            bVar54 = ~bVar60 & (byte)uVar63;
            uVar63 = (uint)bVar54;
            auVar84 = vbroadcastss_avx512vl(local_158);
            auVar100._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM13._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar100._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM13._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar100._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM13._8_4_;
            auVar100._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM13._12_4_
            ;
            in_ZMM13 = ZEXT1664(auVar100);
            auVar84 = vshufps_avx512vl(local_158,local_158,0x55);
            auVar101._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM11._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar101._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM11._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar101._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM11._8_4_;
            auVar101._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM11._12_4_
            ;
            in_ZMM11 = ZEXT1664(auVar101);
            auVar84 = vshufps_avx512vl(local_158,local_158,0xaa);
            auVar102._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM10._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar102._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM10._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar102._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM10._8_4_;
            auVar102._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM10._12_4_
            ;
            in_ZMM10 = ZEXT1664(auVar102);
            auVar84 = vbroadcastss_avx512vl(local_138);
            auVar103._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM9._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar103._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM9._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar103._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM9._8_4_;
            auVar103._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM9._12_4_;
            in_ZMM9 = ZEXT1664(auVar103);
            auVar84 = vshufps_avx512vl(local_138,local_138,0x55);
            auVar104._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM8._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar104._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM8._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar104._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM8._8_4_;
            auVar104._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM8._12_4_;
            in_ZMM8 = ZEXT1664(auVar104);
            auVar84 = vshufps_avx512vl(local_138,local_138,0xaa);
            auVar105._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM7._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar105._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM7._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar105._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM7._8_4_;
            auVar105._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM7._12_4_;
            in_ZMM7 = ZEXT1664(auVar105);
            auVar84 = vbroadcastss_avx512vl(local_148);
            auVar106._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM6._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar106._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM6._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar106._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM6._8_4_;
            auVar106._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM6._12_4_;
            in_ZMM6 = ZEXT1664(auVar106);
            auVar84 = vshufps_avx512vl(local_148,local_148,0x55);
            auVar107._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM5._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar107._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM5._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar107._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM5._8_4_;
            auVar107._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM5._12_4_;
            in_ZMM5 = ZEXT1664(auVar107);
            auVar84 = vshufps_avx512vl(local_148,local_148,0xaa);
            auVar108._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM4._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar108._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM4._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar108._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM4._8_4_;
            auVar108._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM4._12_4_;
            in_ZMM4 = ZEXT1664(auVar108);
            auVar84 = vbroadcastss_avx512vl(local_128);
            auVar109._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar88._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar109._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * auVar88._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar109._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * auVar88._8_4_;
            auVar109._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * auVar88._12_4_;
            auVar84 = vshufps_avx512vl(local_128,local_128,0x55);
            auVar110._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar71._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar110._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * auVar71._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar110._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * auVar71._8_4_;
            auVar110._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * auVar71._12_4_;
            auVar84 = vshufps_avx512vl(local_128,local_128,0xaa);
            auVar111._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar70._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar111._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * auVar70._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar111._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * auVar70._8_4_;
            auVar111._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * auVar70._12_4_;
            auVar84 = vbroadcastss_avx512vl(local_168);
            auVar72._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM24._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar72._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM24._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar72._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM24._8_4_;
            auVar72._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM24._12_4_
            ;
            in_ZMM24 = ZEXT1664(auVar72);
            auVar84 = vshufps_avx512vl(local_168,local_168,0x55);
            auVar73._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM23._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar73._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM23._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar73._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM23._8_4_;
            auVar73._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM23._12_4_
            ;
            in_ZMM23 = ZEXT1664(auVar73);
            auVar84 = vshufps_avx512vl(local_168,local_168,0xaa);
            auVar74._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM22._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar74._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM22._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar74._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM22._8_4_;
            auVar74._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM22._12_4_
            ;
            in_ZMM22 = ZEXT1664(auVar74);
            auVar85 = in_ZMM28._0_16_;
            auVar84 = vbroadcastss_avx512vl(auVar85);
            auVar75._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM21._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar75._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM21._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar75._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM21._8_4_;
            auVar75._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM21._12_4_
            ;
            in_ZMM21 = ZEXT1664(auVar75);
            auVar84 = vshufps_avx512vl(auVar85,auVar85,0x55);
            auVar76._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM20._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar76._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM20._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar76._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM20._8_4_;
            auVar76._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM20._12_4_
            ;
            in_ZMM20 = ZEXT1664(auVar76);
            auVar84 = vshufps_avx512vl(auVar85,auVar85,0xaa);
            auVar77._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM19._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar77._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar77._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
            auVar77._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM19._12_4_
            ;
            in_ZMM19 = ZEXT1664(auVar77);
            auVar85 = in_ZMM30._0_16_;
            auVar84 = vbroadcastss_avx512vl(auVar85);
            auVar78._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM18._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar78._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM18._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar78._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM18._8_4_;
            auVar78._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM18._12_4_
            ;
            in_ZMM18 = ZEXT1664(auVar78);
            auVar84 = vshufps_avx512vl(auVar85,auVar85,0x55);
            auVar79._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM17._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar79._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM17._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar79._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM17._8_4_;
            auVar79._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM17._12_4_
            ;
            in_ZMM17 = ZEXT1664(auVar79);
            auVar84 = vshufps_avx512vl(auVar85,auVar85,0xaa);
            auVar80._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM16._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar80._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM16._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar80._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM16._8_4_;
            auVar80._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM16._12_4_
            ;
            in_ZMM16 = ZEXT1664(auVar80);
            auVar85 = in_ZMM29._0_16_;
            auVar84 = vbroadcastss_avx512vl(auVar85);
            auVar81._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM15._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar81._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM15._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar81._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM15._8_4_;
            auVar81._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM15._12_4_
            ;
            in_ZMM15 = ZEXT1664(auVar81);
            auVar84 = vshufps_avx512vl(auVar85,auVar85,0x55);
            auVar82._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM14._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar82._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM14._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar82._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM14._8_4_;
            auVar82._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM14._12_4_
            ;
            in_ZMM14 = ZEXT1664(auVar82);
            auVar84 = vshufps_avx512vl(auVar85,auVar85,0xaa);
            auVar83._0_4_ =
                 (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * in_ZMM12._0_4_;
            bVar7 = (bool)(bVar60 >> 1 & 1);
            auVar83._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * in_ZMM12._4_4_;
            bVar7 = (bool)(bVar60 >> 2 & 1);
            auVar83._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * in_ZMM12._8_4_;
            auVar83._12_4_ =
                 (uint)(bVar60 >> 3) * auVar84._12_4_ | (uint)!(bool)(bVar60 >> 3) * in_ZMM12._12_4_
            ;
            in_ZMM12 = ZEXT1664(auVar83);
            auVar70 = auVar111;
            auVar71 = auVar110;
            auVar88 = auVar109;
          } while (bVar54 != 0);
        }
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar84 = vsubps_avx512vl(auVar84,auVar97);
        auVar85 = vmulps_avx512vl(auVar97,auVar72);
        auVar86 = vmulps_avx512vl(auVar97,auVar73);
        auVar87 = vmulps_avx512vl(auVar97,auVar74);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar100);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar101);
        auVar88 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar102);
        auVar87 = vmulps_avx512vl(auVar97,auVar75);
        auVar68 = vmulps_avx512vl(auVar97,auVar76);
        auVar69 = vmulps_avx512vl(auVar97,auVar77);
        auVar70 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar103);
        auVar68 = vfmadd231ps_avx512vl(auVar68,auVar84,auVar104);
        auVar69 = vfmadd231ps_avx512vl(auVar69,auVar84,auVar105);
        auVar87 = vmulps_avx512vl(auVar97,auVar78);
        auVar89 = vmulps_avx512vl(auVar97,auVar79);
        auVar90 = vmulps_avx512vl(auVar97,auVar80);
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar106);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar84,auVar107);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar84,auVar108);
        fVar163 = auVar97._0_4_;
        auVar325._0_4_ = auVar81._0_4_ * fVar163;
        fVar174 = auVar97._4_4_;
        auVar325._4_4_ = auVar81._4_4_ * fVar174;
        fVar175 = auVar97._8_4_;
        auVar325._8_4_ = auVar81._8_4_ * fVar175;
        fVar176 = auVar97._12_4_;
        auVar325._12_4_ = auVar81._12_4_ * fVar176;
        auVar321._0_4_ = auVar82._0_4_ * fVar163;
        auVar321._4_4_ = auVar82._4_4_ * fVar174;
        auVar321._8_4_ = auVar82._8_4_ * fVar175;
        auVar321._12_4_ = auVar82._12_4_ * fVar176;
        auVar309._0_4_ = auVar83._0_4_ * fVar163;
        auVar309._4_4_ = auVar83._4_4_ * fVar174;
        auVar309._8_4_ = auVar83._8_4_ * fVar175;
        auVar309._12_4_ = auVar83._12_4_ * fVar176;
        auVar92 = vfmadd231ps_avx512vl(auVar325,auVar84,auVar109);
        auVar93 = vfmadd231ps_avx512vl(auVar321,auVar84,auVar110);
        auVar94 = vfmadd231ps_avx512vl(auVar309,auVar84,auVar111);
        auVar167._0_4_ = auVar89._0_4_ * auVar69._0_4_;
        auVar167._4_4_ = auVar89._4_4_ * auVar69._4_4_;
        auVar167._8_4_ = auVar89._8_4_ * auVar69._8_4_;
        auVar167._12_4_ = auVar89._12_4_ * auVar69._12_4_;
        auVar84 = vfmsub231ps_fma(auVar167,auVar68,auVar90);
        auVar196._0_4_ = auVar90._0_4_ * auVar70._0_4_;
        auVar196._4_4_ = auVar90._4_4_ * auVar70._4_4_;
        auVar196._8_4_ = auVar90._8_4_ * auVar70._8_4_;
        auVar196._12_4_ = auVar90._12_4_ * auVar70._12_4_;
        auVar87 = vfmsub231ps_fma(auVar196,auVar69,auVar91);
        auVar249._0_4_ = auVar68._0_4_ * auVar91._0_4_;
        auVar249._4_4_ = auVar68._4_4_ * auVar91._4_4_;
        auVar249._8_4_ = auVar68._8_4_ * auVar91._8_4_;
        auVar249._12_4_ = auVar68._12_4_ * auVar91._12_4_;
        auVar97 = vfmsub231ps_fma(auVar249,auVar70,auVar89);
        auVar95 = vmulps_avx512vl(auVar86,auVar90);
        auVar95 = vfmsub231ps_avx512vl(auVar95,auVar89,auVar88);
        auVar96 = vmulps_avx512vl(auVar88,auVar91);
        auVar90 = vfmsub231ps_avx512vl(auVar96,auVar85,auVar90);
        auVar89 = vmulps_avx512vl(auVar85,auVar89);
        auVar89 = vfmsub231ps_avx512vl(auVar89,auVar86,auVar91);
        auVar91 = vmulps_avx512vl(auVar68,auVar88);
        auVar91 = vfmsub231ps_avx512vl(auVar91,auVar86,auVar69);
        auVar69 = vmulps_avx512vl(auVar69,auVar85);
        auVar69 = vfmsub231ps_avx512vl(auVar69,auVar88,auVar70);
        auVar70 = vmulps_avx512vl(auVar70,auVar86);
        auVar70 = vfmsub231ps_avx512vl(auVar70,auVar85,auVar68);
        auVar88 = vmulps_avx512vl(auVar88,auVar97);
        auVar86 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar86);
        auVar96 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar85);
        auVar84 = vdivps_avx(auVar84,auVar96);
        auVar85 = vdivps_avx(auVar95,auVar96);
        auVar86 = vdivps_avx(auVar91,auVar96);
        auVar87 = vdivps_avx(auVar87,auVar96);
        auVar88 = vdivps_avx(auVar90,auVar96);
        auVar68 = vdivps_avx(auVar69,auVar96);
        auVar97 = vdivps_avx(auVar97,auVar96);
        auVar69 = vdivps_avx(auVar89,auVar96);
        auVar70 = vdivps_avx(auVar70,auVar96);
        fVar163 = auVar94._0_4_;
        auVar272._0_4_ = fVar163 * auVar97._0_4_;
        fVar174 = auVar94._4_4_;
        auVar272._4_4_ = fVar174 * auVar97._4_4_;
        fVar175 = auVar94._8_4_;
        auVar272._8_4_ = fVar175 * auVar97._8_4_;
        fVar176 = auVar94._12_4_;
        auVar272._12_4_ = fVar176 * auVar97._12_4_;
        auVar283._0_4_ = fVar163 * auVar69._0_4_;
        auVar283._4_4_ = fVar174 * auVar69._4_4_;
        auVar283._8_4_ = fVar175 * auVar69._8_4_;
        auVar283._12_4_ = fVar176 * auVar69._12_4_;
        auVar310._0_4_ = fVar163 * auVar70._0_4_;
        auVar310._4_4_ = fVar174 * auVar70._4_4_;
        auVar310._8_4_ = fVar175 * auVar70._8_4_;
        auVar310._12_4_ = fVar176 * auVar70._12_4_;
        auVar89 = vfmadd231ps_fma(auVar272,auVar93,auVar87);
        auVar90 = vfmadd231ps_fma(auVar283,auVar93,auVar88);
        auVar91 = vfmadd231ps_fma(auVar310,auVar68,auVar93);
        auVar89 = vfmadd231ps_fma(auVar89,auVar92,auVar84);
        auVar90 = vfmadd231ps_fma(auVar90,auVar92,auVar85);
        auVar91 = vfmadd231ps_fma(auVar91,auVar86,auVar92);
      }
      auVar302._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
      auVar302._8_4_ = auVar89._8_4_ ^ 0x80000000;
      auVar302._12_4_ = auVar89._12_4_ ^ 0x80000000;
      auVar273._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
      auVar273._8_4_ = auVar90._8_4_ ^ 0x80000000;
      auVar273._12_4_ = auVar90._12_4_ ^ 0x80000000;
      auVar284._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
      auVar284._8_4_ = auVar91._8_4_ ^ 0x80000000;
      auVar284._12_4_ = auVar91._12_4_ ^ 0x80000000;
      auVar89 = *(undefined1 (*) [16])ray;
      auVar90 = *(undefined1 (*) [16])(ray + 0x10);
      auVar91 = *(undefined1 (*) [16])(ray + 0x20);
      auVar92 = *(undefined1 (*) [16])(ray + 0x40);
      auVar93 = *(undefined1 (*) [16])(ray + 0x50);
      auVar94 = *(undefined1 (*) [16])(ray + 0x60);
      auVar95 = vfmadd231ps_fma(auVar302,auVar91,auVar97);
      auVar96 = vfmadd231ps_fma(auVar273,auVar91,auVar69);
      auVar117 = vfmadd231ps_fma(auVar284,auVar91,auVar70);
      auVar95 = vfmadd231ps_fma(auVar95,auVar90,auVar87);
      auVar96 = vfmadd231ps_fma(auVar96,auVar90,auVar88);
      auVar117 = vfmadd231ps_fma(auVar117,auVar90,auVar68);
      auVar95 = vfmadd231ps_fma(auVar95,auVar89,auVar84);
      auVar96 = vfmadd231ps_fma(auVar96,auVar89,auVar85);
      *(undefined1 (*) [16])ray = auVar95;
      auVar95 = vfmadd231ps_fma(auVar117,auVar89,auVar86);
      *(undefined1 (*) [16])(ray + 0x10) = auVar96;
      *(undefined1 (*) [16])(ray + 0x20) = auVar95;
      auVar97 = vmulps_avx512vl(auVar97,auVar94);
      auVar69 = vmulps_avx512vl(auVar69,auVar94);
      auVar70 = vmulps_avx512vl(auVar70,auVar94);
      auVar87 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar87);
      auVar88 = vfmadd231ps_avx512vl(auVar69,auVar93,auVar88);
      auVar68 = vfmadd231ps_avx512vl(auVar70,auVar93,auVar68);
      auVar84 = vfmadd231ps_fma(auVar87,auVar92,auVar84);
      auVar85 = vfmadd231ps_fma(auVar88,auVar92,auVar85);
      auVar86 = vfmadd231ps_fma(auVar68,auVar92,auVar86);
      *(undefined1 (*) [16])(ray + 0x40) = auVar84;
      *(undefined1 (*) [16])(ray + 0x50) = auVar85;
      *(undefined1 (*) [16])(ray + 0x60) = auVar86;
      local_98 = context->args;
      local_a8._8_8_ = pRVar5;
      local_a8._0_8_ = p_Var59;
      local_28 = vpmovm2d_avx512vl((ulong)uVar55);
      (**(code **)(p_Var59 + 0x98))(local_28,p_Var59 + 0x58,ray);
      local_138._0_8_ = auVar89._0_8_;
      local_138._8_8_ = auVar89._8_8_;
      *(undefined8 *)ray = local_138._0_8_;
      *(undefined8 *)(ray + 8) = local_138._8_8_;
      local_168._0_8_ = auVar90._0_8_;
      local_168._8_8_ = auVar90._8_8_;
      *(undefined8 *)(ray + 0x10) = local_168._0_8_;
      *(undefined8 *)(ray + 0x18) = local_168._8_8_;
      local_158._0_8_ = auVar91._0_8_;
      local_158._8_8_ = auVar91._8_8_;
      *(undefined8 *)(ray + 0x20) = local_158._0_8_;
      *(undefined8 *)(ray + 0x28) = local_158._8_8_;
      local_118._0_8_ = auVar92._0_8_;
      local_118._8_8_ = auVar92._8_8_;
      *(undefined8 *)(ray + 0x40) = local_118._0_8_;
      *(undefined8 *)(ray + 0x48) = local_118._8_8_;
      local_128._0_8_ = auVar93._0_8_;
      local_128._8_8_ = auVar93._8_8_;
      *(undefined8 *)(ray + 0x50) = local_128._0_8_;
      *(undefined8 *)(ray + 0x58) = local_128._8_8_;
      local_148._0_8_ = auVar94._0_8_;
      local_148._8_8_ = auVar94._8_8_;
      *(undefined8 *)(ray + 0x60) = local_148._0_8_;
      *(undefined8 *)(ray + 0x68) = local_148._8_8_;
      pRVar5->instID[0] = 0xffffffff;
      pRVar5->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }